

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  uint uVar75;
  byte bVar76;
  long lVar77;
  byte bVar78;
  byte bVar79;
  ulong uVar80;
  long lVar81;
  bool bVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar149;
  uint uVar150;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar151;
  uint uVar155;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar156;
  vint4 bi_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar180 [64];
  float fVar181;
  float fVar182;
  vint4 bi_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  vint4 bi;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  vint4 ai_2;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  float fVar253;
  float fVar261;
  float fVar262;
  vint4 ai;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar265;
  undefined1 auVar259 [16];
  float fVar264;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar260 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined4 uVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar277;
  undefined1 auVar276 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  RTCFilterFunctionNArguments local_920;
  undefined1 local_8f0 [16];
  undefined1 (*local_8e0) [32];
  Primitive *local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  RTCHitN local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 auVar145 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var_02 [60];
  
  PVar2 = prim[1];
  uVar73 = (ulong)(byte)PVar2;
  lVar81 = uVar73 * 0x25;
  fVar156 = *(float *)(prim + lVar81 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar90 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar81 + 6));
  auVar226._0_4_ = fVar156 * auVar90._0_4_;
  auVar226._4_4_ = fVar156 * auVar90._4_4_;
  auVar226._8_4_ = fVar156 * auVar90._8_4_;
  auVar226._12_4_ = fVar156 * auVar90._12_4_;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar157._0_4_ = fVar156 * auVar89._0_4_;
  auVar157._4_4_ = fVar156 * auVar89._4_4_;
  auVar157._8_4_ = fVar156 * auVar89._8_4_;
  auVar157._12_4_ = fVar156 * auVar89._12_4_;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar73 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar245._4_4_ = auVar157._0_4_;
  auVar245._0_4_ = auVar157._0_4_;
  auVar245._8_4_ = auVar157._0_4_;
  auVar245._12_4_ = auVar157._0_4_;
  auVar97 = vshufps_avx(auVar157,auVar157,0x55);
  auVar98 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar156 = auVar98._0_4_;
  auVar204._0_4_ = fVar156 * auVar92._0_4_;
  fVar253 = auVar98._4_4_;
  auVar204._4_4_ = fVar253 * auVar92._4_4_;
  fVar261 = auVar98._8_4_;
  auVar204._8_4_ = fVar261 * auVar92._8_4_;
  fVar262 = auVar98._12_4_;
  auVar204._12_4_ = fVar262 * auVar92._12_4_;
  auVar183._0_4_ = auVar95._0_4_ * fVar156;
  auVar183._4_4_ = auVar95._4_4_ * fVar253;
  auVar183._8_4_ = auVar95._8_4_ * fVar261;
  auVar183._12_4_ = auVar95._12_4_ * fVar262;
  auVar158._0_4_ = auVar96._0_4_ * fVar156;
  auVar158._4_4_ = auVar96._4_4_ * fVar253;
  auVar158._8_4_ = auVar96._8_4_ * fVar261;
  auVar158._12_4_ = auVar96._12_4_ * fVar262;
  auVar98 = vfmadd231ps_fma(auVar204,auVar97,auVar89);
  auVar100 = vfmadd231ps_fma(auVar183,auVar97,auVar94);
  auVar97 = vfmadd231ps_fma(auVar158,auVar91,auVar97);
  auVar99 = vfmadd231ps_fma(auVar98,auVar245,auVar90);
  auVar100 = vfmadd231ps_fma(auVar100,auVar245,auVar93);
  auVar31 = vfmadd231ps_fma(auVar97,auVar25,auVar245);
  auVar281._4_4_ = auVar226._0_4_;
  auVar281._0_4_ = auVar226._0_4_;
  auVar281._8_4_ = auVar226._0_4_;
  auVar281._12_4_ = auVar226._0_4_;
  auVar97 = vshufps_avx(auVar226,auVar226,0x55);
  auVar98 = vshufps_avx(auVar226,auVar226,0xaa);
  fVar156 = auVar98._0_4_;
  auVar246._0_4_ = fVar156 * auVar92._0_4_;
  fVar253 = auVar98._4_4_;
  auVar246._4_4_ = fVar253 * auVar92._4_4_;
  fVar261 = auVar98._8_4_;
  auVar246._8_4_ = fVar261 * auVar92._8_4_;
  fVar262 = auVar98._12_4_;
  auVar246._12_4_ = fVar262 * auVar92._12_4_;
  auVar235._0_4_ = auVar95._0_4_ * fVar156;
  auVar235._4_4_ = auVar95._4_4_ * fVar253;
  auVar235._8_4_ = auVar95._8_4_ * fVar261;
  auVar235._12_4_ = auVar95._12_4_ * fVar262;
  auVar227._0_4_ = auVar96._0_4_ * fVar156;
  auVar227._4_4_ = auVar96._4_4_ * fVar253;
  auVar227._8_4_ = auVar96._8_4_ * fVar261;
  auVar227._12_4_ = auVar96._12_4_ * fVar262;
  auVar89 = vfmadd231ps_fma(auVar246,auVar97,auVar89);
  auVar92 = vfmadd231ps_fma(auVar235,auVar97,auVar94);
  auVar94 = vfmadd231ps_fma(auVar227,auVar97,auVar91);
  auVar32 = vfmadd231ps_fma(auVar89,auVar281,auVar90);
  auVar157 = vfmadd231ps_fma(auVar92,auVar281,auVar93);
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar158 = vfmadd231ps_fma(auVar94,auVar281,auVar25);
  auVar90 = vandps_avx(auVar274,auVar99);
  auVar269._8_4_ = 0x219392ef;
  auVar269._0_8_ = 0x219392ef219392ef;
  auVar269._12_4_ = 0x219392ef;
  uVar83 = vcmpps_avx512vl(auVar90,auVar269,1);
  bVar11 = (bool)((byte)uVar83 & 1);
  auVar86._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar99._0_4_;
  bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar99._4_4_;
  bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar99._8_4_;
  bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar99._12_4_;
  auVar90 = vandps_avx(auVar274,auVar100);
  uVar83 = vcmpps_avx512vl(auVar90,auVar269,1);
  bVar11 = (bool)((byte)uVar83 & 1);
  auVar87._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar100._0_4_;
  bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar100._4_4_;
  bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar100._8_4_;
  bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar100._12_4_;
  auVar90 = vandps_avx(auVar274,auVar31);
  uVar83 = vcmpps_avx512vl(auVar90,auVar269,1);
  bVar11 = (bool)((byte)uVar83 & 1);
  auVar88._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar31._0_4_;
  bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar31._4_4_;
  bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar31._8_4_;
  bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar31._12_4_;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar270._8_4_ = 0x3f800000;
  auVar270._0_8_ = &DAT_3f8000003f800000;
  auVar270._12_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar86,auVar89,auVar270);
  auVar99 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vfnmadd213ps_fma(auVar87,auVar89,auVar270);
  auVar31 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar90 = vfnmadd213ps_fma(auVar88,auVar89,auVar270);
  auVar30 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  fVar156 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar81 + 0x16)) *
            *(float *)(prim + lVar81 + 0x1a);
  auVar254._4_4_ = fVar156;
  auVar254._0_4_ = fVar156;
  auVar254._8_4_ = fVar156;
  auVar254._12_4_ = fVar156;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar93 = vsubps_avx(auVar89,auVar90);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar92);
  auVar92 = vfmadd213ps_fma(auVar93,auVar254,auVar90);
  auVar90 = vcvtdq2ps_avx(auVar89);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar89 = vpmovsxwd_avx(auVar93);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar93 = vfmadd213ps_fma(auVar89,auVar254,auVar90);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar90 = vpmovsxwd_avx(auVar94);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar83 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar73 * 2 + uVar83 + 6);
  auVar89 = vpmovsxwd_avx(auVar95);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar94 = vfmadd213ps_fma(auVar89,auVar254,auVar90);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar90 = vpmovsxwd_avx(auVar25);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar91);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar95 = vfmadd213ps_fma(auVar89,auVar254,auVar90);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar90 = vpmovsxwd_avx(auVar96);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar73 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar89 = vpmovsxwd_avx(auVar97);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar25 = vfmadd213ps_fma(auVar89,auVar254,auVar90);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar73) + 6);
  auVar90 = vpmovsxwd_avx(auVar98);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar89 = vpmovsxwd_avx(auVar100);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar89 = vfmadd213ps_fma(auVar89,auVar254,auVar90);
  auVar90 = vsubps_avx(auVar92,auVar32);
  auVar255._0_4_ = auVar99._0_4_ * auVar90._0_4_;
  auVar255._4_4_ = auVar99._4_4_ * auVar90._4_4_;
  auVar255._8_4_ = auVar99._8_4_ * auVar90._8_4_;
  auVar255._12_4_ = auVar99._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar93,auVar32);
  auVar205._0_4_ = auVar99._0_4_ * auVar90._0_4_;
  auVar205._4_4_ = auVar99._4_4_ * auVar90._4_4_;
  auVar205._8_4_ = auVar99._8_4_ * auVar90._8_4_;
  auVar205._12_4_ = auVar99._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar94,auVar157);
  auVar247._0_4_ = auVar31._0_4_ * auVar90._0_4_;
  auVar247._4_4_ = auVar31._4_4_ * auVar90._4_4_;
  auVar247._8_4_ = auVar31._8_4_ * auVar90._8_4_;
  auVar247._12_4_ = auVar31._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar95,auVar157);
  auVar184._0_4_ = auVar31._0_4_ * auVar90._0_4_;
  auVar184._4_4_ = auVar31._4_4_ * auVar90._4_4_;
  auVar184._8_4_ = auVar31._8_4_ * auVar90._8_4_;
  auVar184._12_4_ = auVar31._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar25,auVar158);
  auVar236._0_4_ = auVar30._0_4_ * auVar90._0_4_;
  auVar236._4_4_ = auVar30._4_4_ * auVar90._4_4_;
  auVar236._8_4_ = auVar30._8_4_ * auVar90._8_4_;
  auVar236._12_4_ = auVar30._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar89,auVar158);
  auVar159._0_4_ = auVar30._0_4_ * auVar90._0_4_;
  auVar159._4_4_ = auVar30._4_4_ * auVar90._4_4_;
  auVar159._8_4_ = auVar30._8_4_ * auVar90._8_4_;
  auVar159._12_4_ = auVar30._12_4_ * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar255,auVar205);
  auVar89 = vpminsd_avx(auVar247,auVar184);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar89 = vpminsd_avx(auVar236,auVar159);
  uVar273 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar99._4_4_ = uVar273;
  auVar99._0_4_ = uVar273;
  auVar99._8_4_ = uVar273;
  auVar99._12_4_ = uVar273;
  auVar89 = vmaxps_avx512vl(auVar89,auVar99);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar31._8_4_ = 0x3f7ffffa;
  auVar31._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar31._12_4_ = 0x3f7ffffa;
  local_630 = vmulps_avx512vl(auVar90,auVar31);
  auVar90 = vpmaxsd_avx(auVar255,auVar205);
  auVar89 = vpmaxsd_avx(auVar247,auVar184);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar89 = vpmaxsd_avx(auVar236,auVar159);
  uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar30._4_4_ = uVar273;
  auVar30._0_4_ = uVar273;
  auVar30._8_4_ = uVar273;
  auVar30._12_4_ = uVar273;
  auVar89 = vminps_avx512vl(auVar89,auVar30);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar32._8_4_ = 0x3f800003;
  auVar32._0_8_ = 0x3f8000033f800003;
  auVar32._12_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar32);
  auVar89 = vpbroadcastd_avx512vl();
  uVar26 = vcmpps_avx512vl(local_630,auVar90,2);
  uVar83 = vpcmpgtd_avx512vl(auVar89,_DAT_01ff0cf0);
  uVar83 = ((byte)uVar26 & 0xf) & uVar83;
  if ((char)uVar83 == '\0') {
    return;
  }
  local_8e0 = (undefined1 (*) [32])&local_4a0;
  local_620 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar276 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar278 = ZEXT3264(_DAT_02020f20);
  local_8d8 = prim;
LAB_01c72248:
  lVar81 = 0;
  for (uVar73 = uVar83; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  uVar75 = *(uint *)(prim + 2);
  local_8c8 = (ulong)*(uint *)(prim + lVar81 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar75].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_8c8 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar156 = (pGVar4->time_range).lower;
  fVar156 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar156) / ((pGVar4->time_range).upper - fVar156));
  auVar90 = vroundss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),9);
  auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
  fVar156 = fVar156 - auVar90._0_4_;
  fVar253 = 1.0 - fVar156;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar77 = (long)(int)auVar90._0_4_ * 0x38;
  lVar6 = *(long *)(_Var5 + 0x10 + lVar77);
  lVar7 = *(long *)(_Var5 + 0x38 + lVar77);
  lVar8 = *(long *)(_Var5 + 0x48 + lVar77);
  pfVar1 = (float *)(lVar7 + lVar8 * uVar73);
  auVar160._0_4_ = fVar156 * *pfVar1;
  auVar160._4_4_ = fVar156 * pfVar1[1];
  auVar160._8_4_ = fVar156 * pfVar1[2];
  auVar160._12_4_ = fVar156 * pfVar1[3];
  lVar81 = uVar73 + 1;
  pfVar1 = (float *)(lVar7 + lVar8 * lVar81);
  auVar185._0_4_ = fVar156 * *pfVar1;
  auVar185._4_4_ = fVar156 * pfVar1[1];
  auVar185._8_4_ = fVar156 * pfVar1[2];
  auVar185._12_4_ = fVar156 * pfVar1[3];
  p_Var9 = pGVar4[4].occlusionFilterN;
  auVar206._4_4_ = fVar253;
  auVar206._0_4_ = fVar253;
  auVar206._8_4_ = fVar253;
  auVar206._12_4_ = fVar253;
  auVar93 = vfmadd231ps_fma(auVar160,auVar206,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar77) + lVar6 * uVar73));
  auVar94 = vfmadd231ps_fma(auVar185,auVar206,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar77) + lVar6 * lVar81));
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar77 + 0x38) + uVar73 * *(long *)(p_Var9 + lVar77 + 0x48))
  ;
  auVar237._0_4_ = fVar156 * *pfVar1;
  auVar237._4_4_ = fVar156 * pfVar1[1];
  auVar237._8_4_ = fVar156 * pfVar1[2];
  auVar237._12_4_ = fVar156 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar77 + 0x38) + *(long *)(p_Var9 + lVar77 + 0x48) * lVar81)
  ;
  auVar228._0_4_ = fVar156 * *pfVar1;
  auVar228._4_4_ = fVar156 * pfVar1[1];
  auVar228._8_4_ = fVar156 * pfVar1[2];
  auVar228._12_4_ = fVar156 * pfVar1[3];
  auVar92 = vfmadd231ps_fma(auVar237,auVar206,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar77) +
                             *(long *)(p_Var9 + lVar77 + 0x10) * uVar73));
  auVar95 = vfmadd231ps_fma(auVar228,auVar206,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar77) +
                             *(long *)(p_Var9 + lVar77 + 0x10) * lVar81));
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar89 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar90 = vunpcklps_avx512vl(auVar101._0_16_,auVar102._0_16_);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar282 = ZEXT3264(local_8c0);
  auVar96 = local_8c0._0_16_;
  local_850 = vinsertps_avx512f(auVar90,auVar96,0x28);
  auVar248._8_4_ = 0xbeaaaaab;
  auVar248._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar248._12_4_ = 0xbeaaaaab;
  auVar25 = vfnmadd213ps_fma(auVar92,auVar248,auVar93);
  auVar92 = vfmadd213ps_fma(auVar95,auVar248,auVar94);
  auVar249._0_4_ = auVar94._0_4_ + auVar93._0_4_ + auVar25._0_4_ + auVar92._0_4_;
  auVar249._4_4_ = auVar94._4_4_ + auVar93._4_4_ + auVar25._4_4_ + auVar92._4_4_;
  auVar249._8_4_ = auVar94._8_4_ + auVar93._8_4_ + auVar25._8_4_ + auVar92._8_4_;
  auVar249._12_4_ = auVar94._12_4_ + auVar93._12_4_ + auVar25._12_4_ + auVar92._12_4_;
  auVar33._8_4_ = 0x3e800000;
  auVar33._0_8_ = 0x3e8000003e800000;
  auVar33._12_4_ = 0x3e800000;
  auVar90 = vmulps_avx512vl(auVar249,auVar33);
  auVar90 = vsubps_avx(auVar90,auVar89);
  auVar90 = vdpps_avx(auVar90,local_850,0x7f);
  fVar156 = *(float *)(ray + k * 4 + 0x60);
  local_860 = vdpps_avx(local_850,local_850,0x7f);
  auVar256._4_12_ = ZEXT812(0) << 0x20;
  auVar256._0_4_ = local_860._0_4_;
  auVar91 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar256);
  auVar95 = vfnmadd213ss_fma(auVar91,local_860,ZEXT416(0x40000000));
  local_400 = auVar90._0_4_ * auVar91._0_4_ * auVar95._0_4_;
  auVar257._4_4_ = local_400;
  auVar257._0_4_ = local_400;
  auVar257._8_4_ = local_400;
  auVar257._12_4_ = local_400;
  fStack_830 = local_400;
  _local_840 = auVar257;
  fStack_82c = local_400;
  fStack_828 = local_400;
  fStack_824 = local_400;
  auVar90 = vfmadd231ps_fma(auVar89,local_850,auVar257);
  auVar90 = vblendps_avx(auVar90,ZEXT816(0) << 0x40,8);
  auVar89 = vsubps_avx(auVar93,auVar90);
  auVar92 = vsubps_avx(auVar92,auVar90);
  auVar93 = vsubps_avx(auVar25,auVar90);
  auVar90 = vsubps_avx(auVar94,auVar90);
  local_1e0 = auVar89._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  local_720 = ZEXT1632(auVar89);
  local_200 = vpermps_avx2(auVar103,local_720);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  local_220 = vpermps_avx2(auVar104,local_720);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  local_240 = vpermps_avx2(auVar105,local_720);
  local_260 = auVar93._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_760 = ZEXT1632(auVar93);
  local_280 = vpermps_avx2(auVar103,local_760);
  local_2a0 = vpermps_avx2(auVar104,local_760);
  local_2c0 = vpermps_avx2(auVar105,local_760);
  local_2e0 = auVar92._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_740 = ZEXT1632(auVar92);
  local_300 = vpermps_avx2(auVar103,local_740);
  local_320 = vpermps_avx2(auVar104,local_740);
  auVar244 = ZEXT3264(local_320);
  local_340 = vpermps_avx2(auVar105,local_740);
  uVar273 = auVar90._0_4_;
  local_360._4_4_ = uVar273;
  local_360._0_4_ = uVar273;
  fStack_358 = (float)uVar273;
  fStack_354 = (float)uVar273;
  fStack_350 = (float)uVar273;
  fStack_34c = (float)uVar273;
  fStack_348 = (float)uVar273;
  register0x000012dc = uVar273;
  auVar234 = ZEXT3264(_local_360);
  _local_780 = ZEXT1632(auVar90);
  _local_380 = vpermps_avx2(auVar103,_local_780);
  _local_3a0 = vpermps_avx2(auVar104,_local_780);
  _local_3c0 = vpermps_avx2(auVar105,_local_780);
  auVar90 = vmulss_avx512f(auVar96,auVar96);
  auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,auVar102);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar101);
  local_3e0._0_4_ = auVar103._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  local_5a0 = vandps_avx(auVar276._0_32_,local_3e0);
  local_7e0 = ZEXT416((uint)local_400);
  local_400 = fVar156 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5e0 = vpbroadcastd_avx512vl();
  local_600 = vpbroadcastd_avx512vl();
  local_8d0 = 1;
  uVar73 = 0;
  auVar90 = vsqrtss_avx(local_860,local_860);
  auVar89 = vsqrtss_avx(local_860,local_860);
  auVar225 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_8f0 = auVar225._0_16_;
    auVar92 = vmovshdup_avx(local_8f0);
    fVar253 = auVar225._0_4_;
    fVar182 = auVar92._0_4_ - fVar253;
    fVar277 = fVar182 * 0.04761905;
    auVar252._4_4_ = fVar253;
    auVar252._0_4_ = fVar253;
    auVar252._8_4_ = fVar253;
    auVar252._12_4_ = fVar253;
    auVar252._16_4_ = fVar253;
    auVar252._20_4_ = fVar253;
    auVar252._24_4_ = fVar253;
    auVar252._28_4_ = fVar253;
    local_880._4_4_ = fVar182;
    local_880._0_4_ = fVar182;
    local_880._8_4_ = fVar182;
    local_880._12_4_ = fVar182;
    local_880._16_4_ = fVar182;
    local_880._20_4_ = fVar182;
    local_880._24_4_ = fVar182;
    local_880._28_4_ = fVar182;
    auVar92 = vfmadd231ps_fma(auVar252,local_880,auVar278._0_32_);
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = &DAT_3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar103 = vsubps_avx(auVar130,ZEXT1632(auVar92));
    auVar119._4_4_ = fStack_25c;
    auVar119._0_4_ = local_260;
    auVar119._8_4_ = fStack_258;
    auVar119._12_4_ = fStack_254;
    auVar119._16_4_ = fStack_250;
    auVar119._20_4_ = fStack_24c;
    auVar119._24_4_ = fStack_248;
    auVar119._28_4_ = fStack_244;
    fVar253 = auVar92._0_4_;
    auVar125._0_4_ = local_260 * fVar253;
    fVar261 = auVar92._4_4_;
    auVar125._4_4_ = fStack_25c * fVar261;
    fVar262 = auVar92._8_4_;
    auVar125._8_4_ = fStack_258 * fVar262;
    fVar264 = auVar92._12_4_;
    auVar125._12_4_ = fStack_254 * fVar264;
    auVar125._16_4_ = fStack_250 * 0.0;
    auVar125._20_4_ = fStack_24c * 0.0;
    auVar125._24_4_ = fStack_248 * 0.0;
    auVar125._28_4_ = 0;
    auVar276._0_4_ = local_280._0_4_ * fVar253;
    auVar276._4_4_ = local_280._4_4_ * fVar261;
    auVar276._8_4_ = local_280._8_4_ * fVar262;
    auVar276._12_4_ = local_280._12_4_ * fVar264;
    auVar276._16_4_ = local_280._16_4_ * 0.0;
    auVar276._20_4_ = local_280._20_4_ * 0.0;
    auVar276._28_36_ = auVar225._28_36_;
    auVar276._24_4_ = local_280._24_4_ * 0.0;
    auVar278._0_4_ = local_2a0._0_4_ * fVar253;
    auVar278._4_4_ = local_2a0._4_4_ * fVar261;
    auVar278._8_4_ = local_2a0._8_4_ * fVar262;
    auVar278._12_4_ = local_2a0._12_4_ * fVar264;
    auVar278._16_4_ = local_2a0._16_4_ * 0.0;
    auVar278._20_4_ = local_2a0._20_4_ * 0.0;
    auVar278._28_36_ = auVar234._28_36_;
    auVar278._24_4_ = local_2a0._24_4_ * 0.0;
    auVar225._0_4_ = local_2c0._0_4_ * fVar253;
    auVar225._4_4_ = local_2c0._4_4_ * fVar261;
    auVar225._8_4_ = local_2c0._8_4_ * fVar262;
    auVar225._12_4_ = local_2c0._12_4_ * fVar264;
    auVar225._16_4_ = local_2c0._16_4_ * 0.0;
    auVar225._20_4_ = local_2c0._20_4_ * 0.0;
    auVar225._28_36_ = auVar244._28_36_;
    auVar225._24_4_ = local_2c0._24_4_ * 0.0;
    auVar120._4_4_ = uStack_1dc;
    auVar120._0_4_ = local_1e0;
    auVar120._8_4_ = uStack_1d8;
    auVar120._12_4_ = uStack_1d4;
    auVar120._16_4_ = uStack_1d0;
    auVar120._20_4_ = uStack_1cc;
    auVar120._24_4_ = uStack_1c8;
    auVar120._28_4_ = uStack_1c4;
    auVar93 = vfmadd231ps_fma(auVar125,auVar103,auVar120);
    auVar94 = vfmadd231ps_fma(auVar276._0_32_,auVar103,local_200);
    auVar95 = vfmadd231ps_fma(auVar278._0_32_,auVar103,local_220);
    auVar25 = vfmadd231ps_fma(auVar225._0_32_,auVar103,local_240);
    auVar118._4_4_ = uStack_2dc;
    auVar118._0_4_ = local_2e0;
    auVar118._8_4_ = uStack_2d8;
    auVar118._12_4_ = uStack_2d4;
    auVar118._16_4_ = uStack_2d0;
    auVar118._20_4_ = uStack_2cc;
    auVar118._24_4_ = uStack_2c8;
    auVar118._28_4_ = uStack_2c4;
    auVar104 = vmulps_avx512vl(auVar118,ZEXT1632(auVar92));
    auVar111 = ZEXT1632(auVar92);
    auVar105 = vmulps_avx512vl(local_300,auVar111);
    auVar106 = vmulps_avx512vl(local_320,auVar111);
    auVar107 = vmulps_avx512vl(local_340,auVar111);
    auVar91 = vfmadd231ps_fma(auVar104,auVar103,auVar119);
    auVar96 = vfmadd231ps_fma(auVar105,auVar103,local_280);
    auVar97 = vfmadd231ps_fma(auVar106,auVar103,local_2a0);
    auVar98 = vfmadd231ps_fma(auVar107,auVar103,local_2c0);
    auVar106._4_4_ = fVar261 * (float)local_360._4_4_;
    auVar106._0_4_ = fVar253 * (float)local_360._0_4_;
    auVar106._8_4_ = fVar262 * fStack_358;
    auVar106._12_4_ = fVar264 * fStack_354;
    auVar106._16_4_ = fStack_350 * 0.0;
    auVar106._20_4_ = fStack_34c * 0.0;
    auVar106._24_4_ = fStack_348 * 0.0;
    auVar106._28_4_ = fStack_244;
    auVar112._4_4_ = fVar261 * (float)local_380._4_4_;
    auVar112._0_4_ = fVar253 * (float)local_380._0_4_;
    auVar112._8_4_ = fVar262 * fStack_378;
    auVar112._12_4_ = fVar264 * fStack_374;
    auVar112._16_4_ = fStack_370 * 0.0;
    auVar112._20_4_ = fStack_36c * 0.0;
    auVar112._24_4_ = fStack_368 * 0.0;
    auVar112._28_4_ = local_280._28_4_;
    auVar113._4_4_ = fVar261 * (float)local_3a0._4_4_;
    auVar113._0_4_ = fVar253 * (float)local_3a0._0_4_;
    auVar113._8_4_ = fVar262 * fStack_398;
    auVar113._12_4_ = fVar264 * fStack_394;
    auVar113._16_4_ = fStack_390 * 0.0;
    auVar113._20_4_ = fStack_38c * 0.0;
    auVar113._24_4_ = fStack_388 * 0.0;
    auVar113._28_4_ = local_2a0._28_4_;
    auVar114._4_4_ = fVar261 * (float)local_3c0._4_4_;
    auVar114._0_4_ = fVar253 * (float)local_3c0._0_4_;
    auVar114._8_4_ = fVar262 * fStack_3b8;
    auVar114._12_4_ = fVar264 * fStack_3b4;
    auVar114._16_4_ = fStack_3b0 * 0.0;
    auVar114._20_4_ = fStack_3ac * 0.0;
    auVar114._24_4_ = fStack_3a8 * 0.0;
    auVar114._28_4_ = local_2c0._28_4_;
    auVar104 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar118);
    auVar105 = vfmadd231ps_avx512vl(auVar112,auVar103,local_300);
    auVar106 = vfmadd231ps_avx512vl(auVar113,auVar103,local_320);
    auVar107 = vfmadd231ps_avx512vl(auVar114,auVar103,local_340);
    auVar108 = vmulps_avx512vl(auVar111,ZEXT1632(auVar91));
    auVar109 = vmulps_avx512vl(auVar111,ZEXT1632(auVar96));
    auVar110 = vmulps_avx512vl(auVar111,ZEXT1632(auVar97));
    auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar98));
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar93));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,ZEXT1632(auVar94));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,ZEXT1632(auVar95));
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar103,ZEXT1632(auVar25));
    auVar126._0_4_ = auVar104._0_4_ * fVar253;
    auVar126._4_4_ = auVar104._4_4_ * fVar261;
    auVar126._8_4_ = auVar104._8_4_ * fVar262;
    auVar126._12_4_ = auVar104._12_4_ * fVar264;
    auVar126._16_4_ = auVar104._16_4_ * 0.0;
    auVar126._20_4_ = auVar104._20_4_ * 0.0;
    auVar126._24_4_ = auVar104._24_4_ * 0.0;
    auVar126._28_4_ = 0;
    auVar115._4_4_ = auVar105._4_4_ * fVar261;
    auVar115._0_4_ = auVar105._0_4_ * fVar253;
    auVar115._8_4_ = auVar105._8_4_ * fVar262;
    auVar115._12_4_ = auVar105._12_4_ * fVar264;
    auVar115._16_4_ = auVar105._16_4_ * 0.0;
    auVar115._20_4_ = auVar105._20_4_ * 0.0;
    auVar115._24_4_ = auVar105._24_4_ * 0.0;
    auVar115._28_4_ = auVar104._28_4_;
    auVar116._4_4_ = auVar106._4_4_ * fVar261;
    auVar116._0_4_ = auVar106._0_4_ * fVar253;
    auVar116._8_4_ = auVar106._8_4_ * fVar262;
    auVar116._12_4_ = auVar106._12_4_ * fVar264;
    auVar116._16_4_ = auVar106._16_4_ * 0.0;
    auVar116._20_4_ = auVar106._20_4_ * 0.0;
    auVar116._24_4_ = auVar106._24_4_ * 0.0;
    auVar116._28_4_ = auVar105._28_4_;
    auVar117._4_4_ = auVar107._4_4_ * fVar261;
    auVar117._0_4_ = auVar107._0_4_ * fVar253;
    auVar117._8_4_ = auVar107._8_4_ * fVar262;
    auVar117._12_4_ = auVar107._12_4_ * fVar264;
    auVar117._16_4_ = auVar107._16_4_ * 0.0;
    auVar117._20_4_ = auVar107._20_4_ * 0.0;
    auVar117._24_4_ = auVar107._24_4_ * 0.0;
    auVar117._28_4_ = auVar106._28_4_;
    auVar93 = vfmadd231ps_fma(auVar126,auVar103,ZEXT1632(auVar91));
    auVar94 = vfmadd231ps_fma(auVar115,auVar103,ZEXT1632(auVar96));
    auVar95 = vfmadd231ps_fma(auVar116,auVar103,ZEXT1632(auVar97));
    auVar25 = vfmadd231ps_fma(auVar117,auVar103,ZEXT1632(auVar98));
    auVar104 = vmulps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar95));
    auVar112 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar264 * auVar93._12_4_,
                                             CONCAT48(fVar262 * auVar93._8_4_,
                                                      CONCAT44(fVar261 * auVar93._4_4_,
                                                               fVar253 * auVar93._0_4_)))),auVar103,
                          auVar108);
    auVar244 = ZEXT3264(auVar112);
    auVar113 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar94._12_4_ * fVar264,
                                             CONCAT48(auVar94._8_4_ * fVar262,
                                                      CONCAT44(auVar94._4_4_ * fVar261,
                                                               auVar94._0_4_ * fVar253)))),auVar103,
                          auVar109);
    auVar234 = ZEXT3264(auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar110);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar25._12_4_ * fVar264,
                                             CONCAT48(auVar25._8_4_ * fVar262,
                                                      CONCAT44(auVar25._4_4_ * fVar261,
                                                               auVar25._0_4_ * fVar253)))),auVar111,
                          auVar103);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar93),auVar108);
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar94),auVar109);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar95),auVar110);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar25),auVar111);
    auVar132._0_4_ = fVar277 * auVar103._0_4_ * 3.0;
    auVar132._4_4_ = fVar277 * auVar103._4_4_ * 3.0;
    auVar132._8_4_ = fVar277 * auVar103._8_4_ * 3.0;
    auVar132._12_4_ = fVar277 * auVar103._12_4_ * 3.0;
    auVar132._16_4_ = fVar277 * auVar103._16_4_ * 3.0;
    auVar132._20_4_ = fVar277 * auVar103._20_4_ * 3.0;
    auVar132._24_4_ = fVar277 * auVar103._24_4_ * 3.0;
    auVar132._28_4_ = 0;
    auVar133._0_4_ = fVar277 * auVar104._0_4_ * 3.0;
    auVar133._4_4_ = fVar277 * auVar104._4_4_ * 3.0;
    auVar133._8_4_ = fVar277 * auVar104._8_4_ * 3.0;
    auVar133._12_4_ = fVar277 * auVar104._12_4_ * 3.0;
    auVar133._16_4_ = fVar277 * auVar104._16_4_ * 3.0;
    auVar133._20_4_ = fVar277 * auVar104._20_4_ * 3.0;
    auVar133._24_4_ = fVar277 * auVar104._24_4_ * 3.0;
    auVar133._28_4_ = 0;
    auVar134._0_4_ = auVar106._0_4_ * 3.0 * fVar277;
    auVar134._4_4_ = auVar106._4_4_ * 3.0 * fVar277;
    auVar134._8_4_ = auVar106._8_4_ * 3.0 * fVar277;
    auVar134._12_4_ = auVar106._12_4_ * 3.0 * fVar277;
    auVar134._16_4_ = auVar106._16_4_ * 3.0 * fVar277;
    auVar134._20_4_ = auVar106._20_4_ * 3.0 * fVar277;
    auVar134._24_4_ = auVar106._24_4_ * 3.0 * fVar277;
    auVar134._28_4_ = 0;
    fVar253 = auVar107._0_4_ * 3.0 * fVar277;
    fVar261 = auVar107._4_4_ * 3.0 * fVar277;
    auVar121._4_4_ = fVar261;
    auVar121._0_4_ = fVar253;
    fVar262 = auVar107._8_4_ * 3.0 * fVar277;
    auVar121._8_4_ = fVar262;
    fVar264 = auVar107._12_4_ * 3.0 * fVar277;
    auVar121._12_4_ = fVar264;
    fVar266 = auVar107._16_4_ * 3.0 * fVar277;
    auVar121._16_4_ = fVar266;
    fVar267 = auVar107._20_4_ * 3.0 * fVar277;
    auVar121._20_4_ = fVar267;
    fVar268 = auVar107._24_4_ * 3.0 * fVar277;
    auVar121._24_4_ = fVar268;
    auVar121._28_4_ = fVar277;
    auVar92 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar115 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,ZEXT1632(auVar92));
    auVar116 = vpermt2ps_avx512vl(auVar113,_DAT_0205fd20,ZEXT1632(auVar92));
    auVar106 = ZEXT1632(auVar92);
    auVar117 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar106);
    auVar127._0_4_ = auVar105._0_4_ + fVar253;
    auVar127._4_4_ = auVar105._4_4_ + fVar261;
    auVar127._8_4_ = auVar105._8_4_ + fVar262;
    auVar127._12_4_ = auVar105._12_4_ + fVar264;
    auVar127._16_4_ = auVar105._16_4_ + fVar266;
    auVar127._20_4_ = auVar105._20_4_ + fVar267;
    auVar127._24_4_ = auVar105._24_4_ + fVar268;
    auVar127._28_4_ = auVar105._28_4_ + fVar277;
    auVar103 = vmaxps_avx(auVar105,auVar127);
    auVar104 = vminps_avx(auVar105,auVar127);
    auVar107 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,auVar106);
    auVar118 = vpermt2ps_avx512vl(auVar132,_DAT_0205fd20,auVar106);
    auVar119 = vpermt2ps_avx512vl(auVar133,_DAT_0205fd20,auVar106);
    auVar128 = ZEXT1632(auVar92);
    auVar120 = vpermt2ps_avx512vl(auVar134,_DAT_0205fd20,auVar128);
    auVar105 = vpermt2ps_avx512vl(auVar121,_DAT_0205fd20,auVar128);
    auVar108 = vsubps_avx512vl(auVar107,auVar105);
    auVar105 = vsubps_avx(auVar115,auVar112);
    auVar106 = vsubps_avx(auVar116,auVar113);
    auVar121 = vsubps_avx512vl(auVar117,auVar114);
    auVar109 = vmulps_avx512vl(auVar106,auVar134);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar133,auVar121);
    auVar110 = vmulps_avx512vl(auVar121,auVar132);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar134,auVar105);
    auVar111 = vmulps_avx512vl(auVar105,auVar133);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar132,auVar106);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar121,auVar121);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar106);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar105);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar122 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar130);
    auVar111 = vfmadd132ps_avx512vl(auVar122,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar122 = vmulps_avx512vl(auVar106,auVar120);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar119,auVar121);
    auVar123 = vmulps_avx512vl(auVar121,auVar118);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar120,auVar105);
    auVar124 = vmulps_avx512vl(auVar105,auVar119);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar118,auVar106);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar111 = vmulps_avx512vl(auVar122,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar108,auVar107);
    auVar103 = vmaxps_avx512vl(auVar103,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar103);
    auVar103 = vminps_avx512vl(auVar108,auVar107);
    auVar103 = vminps_avx(auVar104,auVar103);
    auVar103 = vsubps_avx512vl(auVar103,auVar109);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar104 = vmulps_avx512vl(auVar111,auVar107);
    auVar108._8_4_ = 0x3f7ffffc;
    auVar108._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar108._12_4_ = 0x3f7ffffc;
    auVar108._16_4_ = 0x3f7ffffc;
    auVar108._20_4_ = 0x3f7ffffc;
    auVar108._24_4_ = 0x3f7ffffc;
    auVar108._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar103,auVar108);
    auVar122._4_4_ = auVar104._4_4_ * auVar104._4_4_;
    auVar122._0_4_ = auVar104._0_4_ * auVar104._0_4_;
    auVar122._8_4_ = auVar104._8_4_ * auVar104._8_4_;
    auVar122._12_4_ = auVar104._12_4_ * auVar104._12_4_;
    auVar122._16_4_ = auVar104._16_4_ * auVar104._16_4_;
    auVar122._20_4_ = auVar104._20_4_ * auVar104._20_4_;
    auVar122._24_4_ = auVar104._24_4_ * auVar104._24_4_;
    auVar122._28_4_ = local_8a0._28_4_;
    auVar103 = vrsqrt14ps_avx512vl(auVar110);
    auVar109._8_4_ = 0xbf000000;
    auVar109._0_8_ = 0xbf000000bf000000;
    auVar109._12_4_ = 0xbf000000;
    auVar109._16_4_ = 0xbf000000;
    auVar109._20_4_ = 0xbf000000;
    auVar109._24_4_ = 0xbf000000;
    auVar109._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar110,auVar109);
    auVar123._4_4_ = auVar103._4_4_ * auVar104._4_4_;
    auVar123._0_4_ = auVar103._0_4_ * auVar104._0_4_;
    auVar123._8_4_ = auVar103._8_4_ * auVar104._8_4_;
    auVar123._12_4_ = auVar103._12_4_ * auVar104._12_4_;
    auVar123._16_4_ = auVar103._16_4_ * auVar104._16_4_;
    auVar123._20_4_ = auVar103._20_4_ * auVar104._20_4_;
    auVar123._24_4_ = auVar103._24_4_ * auVar104._24_4_;
    auVar123._28_4_ = auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar104,auVar123);
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar110);
    auVar124._4_4_ = auVar104._4_4_ * auVar105._4_4_;
    auVar124._0_4_ = auVar104._0_4_ * auVar105._0_4_;
    auVar124._8_4_ = auVar104._8_4_ * auVar105._8_4_;
    auVar124._12_4_ = auVar104._12_4_ * auVar105._12_4_;
    auVar124._16_4_ = auVar104._16_4_ * auVar105._16_4_;
    auVar124._20_4_ = auVar104._20_4_ * auVar105._20_4_;
    auVar124._24_4_ = auVar104._24_4_ * auVar105._24_4_;
    auVar124._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar106,auVar104);
    auVar107 = vmulps_avx512vl(auVar121,auVar104);
    auVar108 = vsubps_avx512vl(auVar128,auVar112);
    auVar109 = vsubps_avx512vl(auVar128,auVar113);
    auVar110 = vsubps_avx512vl(auVar128,auVar114);
    auVar111 = vmulps_avx512vl(auVar282._0_32_,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar108);
    auVar123 = vmulps_avx512vl(auVar110,auVar110);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar109,auVar109);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar108,auVar108);
    auVar125 = vmulps_avx512vl(auVar282._0_32_,auVar107);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar103,auVar102);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar101);
    auVar107 = vmulps_avx512vl(auVar110,auVar107);
    auVar103 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar124);
    local_6e0 = vmulps_avx512vl(auVar125,auVar125);
    auVar107 = vsubps_avx512vl(local_3e0,local_6e0);
    auVar124 = vmulps_avx512vl(auVar125,auVar103);
    auVar111 = vsubps_avx512vl(auVar111,auVar124);
    auVar124 = vaddps_avx512vl(auVar111,auVar111);
    auVar111 = vmulps_avx512vl(auVar103,auVar103);
    auVar123 = vsubps_avx512vl(auVar123,auVar111);
    auVar122 = vsubps_avx512vl(auVar123,auVar122);
    auVar126 = vmulps_avx512vl(auVar124,auVar124);
    auVar111._8_4_ = 0x40800000;
    auVar111._0_8_ = 0x4080000040800000;
    auVar111._12_4_ = 0x40800000;
    auVar111._16_4_ = 0x40800000;
    auVar111._20_4_ = 0x40800000;
    auVar111._24_4_ = 0x40800000;
    auVar111._28_4_ = 0x40800000;
    auVar111 = vmulps_avx512vl(auVar107,auVar111);
    auVar127 = vmulps_avx512vl(auVar111,auVar122);
    auVar127 = vsubps_avx512vl(auVar126,auVar127);
    uVar84 = vcmpps_avx512vl(auVar127,auVar128,5);
    bVar76 = (byte)uVar84;
    if (bVar76 == 0) {
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar122);
    }
    else {
      auVar127 = vsqrtps_avx512vl(auVar127);
      auVar128 = vaddps_avx512vl(auVar107,auVar107);
      auVar129 = vrcp14ps_avx512vl(auVar128);
      auVar130 = vfnmadd213ps_avx512vl(auVar128,auVar129,auVar130);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar129,auVar129);
      auVar129._8_4_ = 0x80000000;
      auVar129._0_8_ = 0x8000000080000000;
      auVar129._12_4_ = 0x80000000;
      auVar129._16_4_ = 0x80000000;
      auVar129._20_4_ = 0x80000000;
      auVar129._24_4_ = 0x80000000;
      auVar129._28_4_ = 0x80000000;
      auVar128 = vxorps_avx512vl(auVar124,auVar129);
      auVar128 = vsubps_avx512vl(auVar128,auVar127);
      auVar128 = vmulps_avx512vl(auVar128,auVar130);
      auVar127 = vsubps_avx512vl(auVar127,auVar124);
      auVar127 = vmulps_avx512vl(auVar127,auVar130);
      auVar130 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar103);
      local_660 = vmulps_avx512vl(auVar104,auVar130);
      auVar130 = vfmadd213ps_avx512vl(auVar125,auVar127,auVar103);
      local_680 = vmulps_avx512vl(auVar104,auVar130);
      auVar169._8_4_ = 0x7f800000;
      auVar169._0_8_ = 0x7f8000007f800000;
      auVar169._12_4_ = 0x7f800000;
      auVar169._16_4_ = 0x7f800000;
      auVar169._20_4_ = 0x7f800000;
      auVar169._24_4_ = 0x7f800000;
      auVar169._28_4_ = 0x7f800000;
      auVar130 = vblendmps_avx512vl(auVar169,auVar128);
      auVar128._0_4_ =
           (uint)(bVar76 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar76 & 1) * local_680._0_4_;
      bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar11 * auVar130._4_4_ | (uint)!bVar11 * local_680._4_4_;
      bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar11 * auVar130._8_4_ | (uint)!bVar11 * local_680._8_4_;
      bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar11 * auVar130._12_4_ | (uint)!bVar11 * local_680._12_4_;
      bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * local_680._16_4_;
      bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * local_680._20_4_;
      bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar11 * auVar130._24_4_ | (uint)!bVar11 * local_680._24_4_;
      bVar11 = SUB81(uVar84 >> 7,0);
      auVar128._28_4_ = (uint)bVar11 * auVar130._28_4_ | (uint)!bVar11 * local_680._28_4_;
      auVar170._8_4_ = 0xff800000;
      auVar170._0_8_ = 0xff800000ff800000;
      auVar170._12_4_ = 0xff800000;
      auVar170._16_4_ = 0xff800000;
      auVar170._20_4_ = 0xff800000;
      auVar170._24_4_ = 0xff800000;
      auVar170._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar170,auVar127);
      auVar131._0_4_ =
           (uint)(bVar76 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar127._0_4_;
      bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar11 * auVar130._4_4_ | (uint)!bVar11 * auVar127._4_4_;
      bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar11 * auVar130._8_4_ | (uint)!bVar11 * auVar127._8_4_;
      bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar11 * auVar130._12_4_ | (uint)!bVar11 * auVar127._12_4_;
      bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * auVar127._16_4_;
      bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * auVar127._20_4_;
      bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar11 * auVar130._24_4_ | (uint)!bVar11 * auVar127._24_4_;
      bVar11 = SUB81(uVar84 >> 7,0);
      auVar131._28_4_ = (uint)bVar11 * auVar130._28_4_ | (uint)!bVar11 * auVar127._28_4_;
      in_ZMM31 = ZEXT3264(auVar131);
      auVar171._8_4_ = 0x7fffffff;
      auVar171._0_8_ = 0x7fffffff7fffffff;
      auVar171._12_4_ = 0x7fffffff;
      auVar171._16_4_ = 0x7fffffff;
      auVar171._20_4_ = 0x7fffffff;
      auVar171._24_4_ = 0x7fffffff;
      auVar171._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6e0,auVar171);
      auVar127 = vmaxps_avx512vl(local_5a0,auVar131);
      auVar135._8_4_ = 0x36000000;
      auVar135._0_8_ = 0x3600000036000000;
      auVar135._12_4_ = 0x36000000;
      auVar135._16_4_ = 0x36000000;
      auVar135._20_4_ = 0x36000000;
      auVar135._24_4_ = 0x36000000;
      auVar135._28_4_ = 0x36000000;
      auVar130 = vmulps_avx512vl(auVar127,auVar135);
      auVar127 = vandps_avx(auVar107,auVar171);
      uVar80 = vcmpps_avx512vl(auVar127,auVar130,1);
      uVar84 = uVar84 & uVar80;
      bVar79 = (byte)uVar84;
      if (bVar79 != 0) {
        uVar80 = vcmpps_avx512vl(auVar122,_DAT_02020f00,2);
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar130 = vblendmps_avx512vl(auVar122,auVar198);
        bVar74 = (byte)uVar80;
        uVar85 = (uint)(bVar74 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar127._0_4_;
        bVar11 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar149 = (uint)bVar11 * auVar130._4_4_ | (uint)!bVar11 * auVar127._4_4_;
        bVar11 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar150 = (uint)bVar11 * auVar130._8_4_ | (uint)!bVar11 * auVar127._8_4_;
        bVar11 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar151 = (uint)bVar11 * auVar130._12_4_ | (uint)!bVar11 * auVar127._12_4_;
        bVar11 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar152 = (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * auVar127._16_4_;
        bVar11 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar153 = (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * auVar127._20_4_;
        bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar154 = (uint)bVar11 * auVar130._24_4_ | (uint)!bVar11 * auVar127._24_4_;
        bVar11 = SUB81(uVar80 >> 7,0);
        uVar155 = (uint)bVar11 * auVar130._28_4_ | (uint)!bVar11 * auVar127._28_4_;
        auVar128._0_4_ = (bVar79 & 1) * uVar85 | !(bool)(bVar79 & 1) * auVar128._0_4_;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar128._4_4_ = bVar11 * uVar149 | !bVar11 * auVar128._4_4_;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar128._8_4_ = bVar11 * uVar150 | !bVar11 * auVar128._8_4_;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar128._12_4_ = bVar11 * uVar151 | !bVar11 * auVar128._12_4_;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar128._16_4_ = bVar11 * uVar152 | !bVar11 * auVar128._16_4_;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar128._20_4_ = bVar11 * uVar153 | !bVar11 * auVar128._20_4_;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar128._24_4_ = bVar11 * uVar154 | !bVar11 * auVar128._24_4_;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar128._28_4_ = bVar11 * uVar155 | !bVar11 * auVar128._28_4_;
        auVar122 = vblendmps_avx512vl(auVar198,auVar122);
        bVar11 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar80 >> 6) & 1);
        bVar22 = SUB81(uVar80 >> 7,0);
        bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar84 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar84 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar84 >> 6) & 1);
        bVar23 = SUB81(uVar84 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar23 *
                                      ((uint)bVar22 * auVar122._28_4_ | !bVar22 * uVar155) |
                                      !bVar23 * auVar131._28_4_,
                                      CONCAT424((uint)bVar21 *
                                                ((uint)bVar20 * auVar122._24_4_ | !bVar20 * uVar154)
                                                | !bVar21 * auVar131._24_4_,
                                                CONCAT420((uint)bVar19 *
                                                          ((uint)bVar18 * auVar122._20_4_ |
                                                          !bVar18 * uVar153) |
                                                          !bVar19 * auVar131._20_4_,
                                                          CONCAT416((uint)bVar17 *
                                                                    ((uint)bVar16 * auVar122._16_4_
                                                                    | !bVar16 * uVar152) |
                                                                    !bVar17 * auVar131._16_4_,
                                                                    CONCAT412((uint)bVar15 *
                                                                              ((uint)bVar14 *
                                                                               auVar122._12_4_ |
                                                                              !bVar14 * uVar151) |
                                                                              !bVar15 * auVar131.
                                                  _12_4_,CONCAT48((uint)bVar13 *
                                                                  ((uint)bVar12 * auVar122._8_4_ |
                                                                  !bVar12 * uVar150) |
                                                                  !bVar13 * auVar131._8_4_,
                                                                  CONCAT44((uint)bVar82 *
                                                                           ((uint)bVar11 *
                                                                            auVar122._4_4_ |
                                                                           !bVar11 * uVar149) |
                                                                           !bVar82 * auVar131._4_4_,
                                                                           (uint)(bVar79 & 1) *
                                                                           ((uint)(bVar74 & 1) *
                                                                            auVar122._0_4_ |
                                                                           !(bool)(bVar74 & 1) *
                                                                           uVar85) | !(bool)(bVar79 
                                                  & 1) * auVar131._0_4_))))))));
        bVar76 = (~bVar79 | bVar74) & bVar76;
      }
    }
    if ((bVar76 & 0x7f) == 0) {
LAB_01c72fed:
      auVar282 = ZEXT3264(local_8c0);
      auVar278 = ZEXT3264(_DAT_02020f20);
      auVar276 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    else {
      fVar253 = *(float *)(ray + k * 4 + 0x100) - (float)local_7e0._0_4_;
      auVar172._4_4_ = fVar253;
      auVar172._0_4_ = fVar253;
      auVar172._8_4_ = fVar253;
      auVar172._12_4_ = fVar253;
      auVar172._16_4_ = fVar253;
      auVar172._20_4_ = fVar253;
      auVar172._24_4_ = fVar253;
      auVar172._28_4_ = fVar253;
      auVar122 = vminps_avx512vl(auVar172,in_ZMM31._0_32_);
      auVar70._4_4_ = fStack_3fc;
      auVar70._0_4_ = local_400;
      auVar70._8_4_ = fStack_3f8;
      auVar70._12_4_ = fStack_3f4;
      auVar70._16_4_ = fStack_3f0;
      auVar70._20_4_ = fStack_3ec;
      auVar70._24_4_ = fStack_3e8;
      auVar70._28_4_ = fStack_3e4;
      auVar127 = vmaxps_avx512vl(auVar70,auVar128);
      auVar110 = vmulps_avx512vl(auVar110,auVar134);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar133,auVar110);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar132,auVar109);
      auVar282 = ZEXT3264(local_8c0);
      auVar109 = vmulps_avx512vl(local_8c0,auVar134);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,auVar133);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,auVar132);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar110);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar110,auVar130,1);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar132);
      auVar108 = vxorps_avx512vl(auVar108,auVar132);
      auVar133 = vrcp14ps_avx512vl(auVar109);
      auVar134 = vxorps_avx512vl(auVar109,auVar132);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar129 = vfnmadd213ps_avx512vl(auVar133,auVar109,auVar128);
      auVar129 = vfmadd132ps_avx512vl(auVar129,auVar133,auVar133);
      auVar129 = vmulps_avx512vl(auVar129,auVar108);
      uVar27 = vcmpps_avx512vl(auVar109,auVar134,1);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar129,auVar135);
      auVar136._0_4_ =
           (uint)(bVar79 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar133._0_4_;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar11 * auVar108._4_4_ | (uint)!bVar11 * auVar133._4_4_;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar11 * auVar108._8_4_ | (uint)!bVar11 * auVar133._8_4_;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar11 * auVar108._12_4_ | (uint)!bVar11 * auVar133._12_4_;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar11 * auVar108._16_4_ | (uint)!bVar11 * auVar133._16_4_;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar11 * auVar108._20_4_ | (uint)!bVar11 * auVar133._20_4_;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar11 * auVar108._24_4_ | (uint)!bVar11 * auVar133._24_4_;
      auVar136._28_4_ =
           (uint)(bVar79 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar133._28_4_;
      auVar108 = vmaxps_avx(auVar127,auVar136);
      uVar27 = vcmpps_avx512vl(auVar109,auVar134,6);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar137._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * auVar129._0_4_;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._4_4_;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._8_4_;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._12_4_;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._16_4_;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._20_4_;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * auVar129._24_4_;
      auVar137._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar129._28_4_;
      auVar109 = vminps_avx(auVar122,auVar137);
      auVar92 = vxorps_avx512vl(auVar134._0_16_,auVar134._0_16_);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar92),auVar115);
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar92),auVar116);
      auVar127 = ZEXT1632(auVar92);
      auVar117 = vsubps_avx512vl(auVar127,auVar117);
      auVar49._4_4_ = auVar117._4_4_ * auVar120._4_4_;
      auVar49._0_4_ = auVar117._0_4_ * auVar120._0_4_;
      auVar49._8_4_ = auVar117._8_4_ * auVar120._8_4_;
      auVar49._12_4_ = auVar117._12_4_ * auVar120._12_4_;
      auVar49._16_4_ = auVar117._16_4_ * auVar120._16_4_;
      auVar49._20_4_ = auVar117._20_4_ * auVar120._20_4_;
      auVar49._24_4_ = auVar117._24_4_ * auVar120._24_4_;
      auVar49._28_4_ = auVar117._28_4_;
      auVar116 = vfnmsub231ps_avx512vl(auVar49,auVar119,auVar116);
      auVar115 = vfnmadd231ps_avx512vl(auVar116,auVar118,auVar115);
      auVar116 = vmulps_avx512vl(local_8c0,auVar120);
      auVar116 = vfnmsub231ps_avx512vl(auVar116,auVar102,auVar119);
      auVar116 = vfnmadd231ps_avx512vl(auVar116,auVar101,auVar118);
      vandps_avx512vl(auVar116,auVar110);
      uVar26 = vcmpps_avx512vl(auVar116,auVar130,1);
      auVar110 = vxorps_avx512vl(auVar115,auVar132);
      auVar115 = vrcp14ps_avx512vl(auVar116);
      auVar117 = vxorps_avx512vl(auVar116,auVar132);
      auVar122 = vfnmadd213ps_avx512vl(auVar115,auVar116,auVar128);
      auVar92 = vfmadd132ps_fma(auVar122,auVar115,auVar115);
      fVar253 = auVar92._0_4_ * auVar110._0_4_;
      fVar261 = auVar92._4_4_ * auVar110._4_4_;
      auVar50._4_4_ = fVar261;
      auVar50._0_4_ = fVar253;
      fVar262 = auVar92._8_4_ * auVar110._8_4_;
      auVar50._8_4_ = fVar262;
      fVar264 = auVar92._12_4_ * auVar110._12_4_;
      auVar50._12_4_ = fVar264;
      fVar277 = auVar110._16_4_ * 0.0;
      auVar50._16_4_ = fVar277;
      fVar266 = auVar110._20_4_ * 0.0;
      auVar50._20_4_ = fVar266;
      fVar267 = auVar110._24_4_ * 0.0;
      auVar50._24_4_ = fVar267;
      auVar50._28_4_ = auVar110._28_4_;
      uVar27 = vcmpps_avx512vl(auVar116,auVar117,1);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar122 = vblendmps_avx512vl(auVar50,auVar135);
      auVar138._0_4_ =
           (uint)(bVar79 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar115._0_4_;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar11 * auVar122._4_4_ | (uint)!bVar11 * auVar115._4_4_;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar11 * auVar122._8_4_ | (uint)!bVar11 * auVar115._8_4_;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar11 * auVar122._12_4_ | (uint)!bVar11 * auVar115._12_4_;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar11 * auVar122._16_4_ | (uint)!bVar11 * auVar115._16_4_;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar11 * auVar122._20_4_ | (uint)!bVar11 * auVar115._20_4_;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar11 * auVar122._24_4_ | (uint)!bVar11 * auVar115._24_4_;
      auVar138._28_4_ =
           (uint)(bVar79 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar115._28_4_;
      _local_700 = vmaxps_avx(auVar108,auVar138);
      uVar27 = vcmpps_avx512vl(auVar116,auVar117,6);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar139._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar253;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar261;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar262;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar264;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar277;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar266;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar267;
      auVar139._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar110._28_4_;
      local_440 = vminps_avx(auVar109,auVar139);
      uVar26 = vcmpps_avx512vl(_local_700,local_440,2);
      bVar76 = bVar76 & 0x7f & (byte)uVar26;
      if (bVar76 == 0) goto LAB_01c72fed;
      auVar110 = vmaxps_avx512vl(auVar127,local_8a0);
      auVar108 = vminps_avx512vl(local_660,auVar128);
      auVar56 = ZEXT412(0);
      auVar109 = ZEXT1232(auVar56) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar56) << 0x20);
      auVar115 = vminps_avx512vl(local_680,auVar128);
      auVar51._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar108._28_4_ + 7.0;
      auVar92 = vfmadd213ps_fma(auVar51,local_880,auVar252);
      local_660 = ZEXT1632(auVar92);
      auVar108 = vmaxps_avx(auVar115,ZEXT1232(auVar56) << 0x20);
      auVar52._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar108._28_4_ + 7.0;
      auVar92 = vfmadd213ps_fma(auVar52,local_880,auVar252);
      local_680 = ZEXT1632(auVar92);
      auVar173._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar173._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar173._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar173._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar173._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar173._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar173._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar173._28_4_ = 0;
      auVar108 = vsubps_avx(auVar123,auVar173);
      auVar110 = vmulps_avx512vl(auVar111,auVar108);
      auVar110 = vsubps_avx512vl(auVar126,auVar110);
      uVar26 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar56) << 0x20,5);
      bVar79 = (byte)uVar26;
      if (bVar79 == 0) {
        auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar140._8_4_ = 0x7f800000;
        auVar140._0_8_ = 0x7f8000007f800000;
        auVar140._12_4_ = 0x7f800000;
        auVar140._16_4_ = 0x7f800000;
        auVar140._20_4_ = 0x7f800000;
        auVar140._24_4_ = 0x7f800000;
        auVar140._28_4_ = 0x7f800000;
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
      }
      else {
        auVar93 = vxorps_avx512vl(auVar119._0_16_,auVar119._0_16_);
        uVar84 = vcmpps_avx512vl(auVar110,auVar127,5);
        auVar109 = vsqrtps_avx(auVar110);
        auVar199._0_4_ = auVar107._0_4_ + auVar107._0_4_;
        auVar199._4_4_ = auVar107._4_4_ + auVar107._4_4_;
        auVar199._8_4_ = auVar107._8_4_ + auVar107._8_4_;
        auVar199._12_4_ = auVar107._12_4_ + auVar107._12_4_;
        auVar199._16_4_ = auVar107._16_4_ + auVar107._16_4_;
        auVar199._20_4_ = auVar107._20_4_ + auVar107._20_4_;
        auVar199._24_4_ = auVar107._24_4_ + auVar107._24_4_;
        auVar199._28_4_ = auVar107._28_4_ + auVar107._28_4_;
        auVar110 = vrcp14ps_avx512vl(auVar199);
        auVar111 = vfnmadd213ps_avx512vl(auVar199,auVar110,auVar128);
        auVar92 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
        auVar41._8_4_ = 0x80000000;
        auVar41._0_8_ = 0x8000000080000000;
        auVar41._12_4_ = 0x80000000;
        auVar41._16_4_ = 0x80000000;
        auVar41._20_4_ = 0x80000000;
        auVar41._24_4_ = 0x80000000;
        auVar41._28_4_ = 0x80000000;
        auVar110 = vxorps_avx512vl(auVar124,auVar41);
        auVar110 = vsubps_avx(auVar110,auVar109);
        auVar53._4_4_ = auVar110._4_4_ * auVar92._4_4_;
        auVar53._0_4_ = auVar110._0_4_ * auVar92._0_4_;
        auVar53._8_4_ = auVar110._8_4_ * auVar92._8_4_;
        auVar53._12_4_ = auVar110._12_4_ * auVar92._12_4_;
        auVar53._16_4_ = auVar110._16_4_ * 0.0;
        auVar53._20_4_ = auVar110._20_4_ * 0.0;
        auVar53._24_4_ = auVar110._24_4_ * 0.0;
        auVar53._28_4_ = 0x3e000000;
        auVar109 = vsubps_avx512vl(auVar109,auVar124);
        auVar54._4_4_ = auVar109._4_4_ * auVar92._4_4_;
        auVar54._0_4_ = auVar109._0_4_ * auVar92._0_4_;
        auVar54._8_4_ = auVar109._8_4_ * auVar92._8_4_;
        auVar54._12_4_ = auVar109._12_4_ * auVar92._12_4_;
        auVar54._16_4_ = auVar109._16_4_ * 0.0;
        auVar54._20_4_ = auVar109._20_4_ * 0.0;
        auVar54._24_4_ = auVar109._24_4_ * 0.0;
        auVar54._28_4_ = fVar182;
        auVar109 = vfmadd213ps_avx512vl(auVar125,auVar53,auVar103);
        auVar55._4_4_ = auVar104._4_4_ * auVar109._4_4_;
        auVar55._0_4_ = auVar104._0_4_ * auVar109._0_4_;
        auVar55._8_4_ = auVar104._8_4_ * auVar109._8_4_;
        auVar55._12_4_ = auVar104._12_4_ * auVar109._12_4_;
        auVar55._16_4_ = auVar104._16_4_ * auVar109._16_4_;
        auVar55._20_4_ = auVar104._20_4_ * auVar109._20_4_;
        auVar55._24_4_ = auVar104._24_4_ * auVar109._24_4_;
        auVar55._28_4_ = auVar110._28_4_;
        auVar109 = vmulps_avx512vl(auVar101,auVar53);
        auVar110 = vmulps_avx512vl(auVar102,auVar53);
        auVar116 = vmulps_avx512vl(local_8c0,auVar53);
        auVar111 = vfmadd213ps_avx512vl(auVar105,auVar55,auVar112);
        auVar111 = vsubps_avx512vl(auVar109,auVar111);
        auVar109 = vfmadd213ps_avx512vl(auVar106,auVar55,auVar113);
        auVar115 = vsubps_avx512vl(auVar110,auVar109);
        auVar92 = vfmadd213ps_fma(auVar55,auVar121,auVar114);
        auVar110 = vsubps_avx(auVar116,ZEXT1632(auVar92));
        auVar103 = vfmadd213ps_avx512vl(auVar125,auVar54,auVar103);
        auVar104 = vmulps_avx512vl(auVar104,auVar103);
        auVar103 = vmulps_avx512vl(auVar101,auVar54);
        auVar116 = vmulps_avx512vl(auVar102,auVar54);
        auVar117 = vmulps_avx512vl(local_8c0,auVar54);
        auVar92 = vfmadd213ps_fma(auVar105,auVar104,auVar112);
        auVar109 = vsubps_avx(auVar103,ZEXT1632(auVar92));
        auVar92 = vfmadd213ps_fma(auVar106,auVar104,auVar113);
        auVar103 = vsubps_avx512vl(auVar116,ZEXT1632(auVar92));
        auVar92 = vfmadd213ps_fma(auVar121,auVar104,auVar114);
        auVar104 = vsubps_avx512vl(auVar117,ZEXT1632(auVar92));
        auVar219._8_4_ = 0x7f800000;
        auVar219._0_8_ = 0x7f8000007f800000;
        auVar219._12_4_ = 0x7f800000;
        auVar219._16_4_ = 0x7f800000;
        auVar219._20_4_ = 0x7f800000;
        auVar219._24_4_ = 0x7f800000;
        auVar219._28_4_ = 0x7f800000;
        auVar105 = vblendmps_avx512vl(auVar219,auVar53);
        bVar11 = (bool)((byte)uVar84 & 1);
        auVar140._0_4_ = (uint)bVar11 * auVar105._0_4_ | (uint)!bVar11 * auVar112._0_4_;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * auVar112._4_4_;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * auVar112._8_4_;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * auVar112._12_4_;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar11 * auVar105._16_4_ | (uint)!bVar11 * auVar112._16_4_;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar11 * auVar105._20_4_ | (uint)!bVar11 * auVar112._20_4_;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar11 * auVar105._24_4_ | (uint)!bVar11 * auVar112._24_4_;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar140._28_4_ = (uint)bVar11 * auVar105._28_4_ | (uint)!bVar11 * auVar112._28_4_;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar105 = vblendmps_avx512vl(auVar220,auVar54);
        bVar11 = (bool)((byte)uVar84 & 1);
        auVar141._0_4_ = (uint)bVar11 * auVar105._0_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar141._16_4_ = (uint)bVar11 * auVar105._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar141._20_4_ = (uint)bVar11 * auVar105._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar141._24_4_ = (uint)bVar11 * auVar105._24_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar141._28_4_ = (uint)bVar11 * auVar105._28_4_ | (uint)!bVar11 * -0x800000;
        auVar271._8_4_ = 0x7fffffff;
        auVar271._0_8_ = 0x7fffffff7fffffff;
        auVar271._12_4_ = 0x7fffffff;
        auVar271._16_4_ = 0x7fffffff;
        auVar271._20_4_ = 0x7fffffff;
        auVar271._24_4_ = 0x7fffffff;
        auVar271._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar271,local_6e0);
        auVar105 = vmaxps_avx(local_5a0,auVar105);
        auVar42._8_4_ = 0x36000000;
        auVar42._0_8_ = 0x3600000036000000;
        auVar42._12_4_ = 0x36000000;
        auVar42._16_4_ = 0x36000000;
        auVar42._20_4_ = 0x36000000;
        auVar42._24_4_ = 0x36000000;
        auVar42._28_4_ = 0x36000000;
        auVar106 = vmulps_avx512vl(auVar105,auVar42);
        auVar105 = vandps_avx(auVar107,auVar271);
        uVar80 = vcmpps_avx512vl(auVar105,auVar106,1);
        uVar84 = uVar84 & uVar80;
        bVar74 = (byte)uVar84;
        if (bVar74 != 0) {
          uVar80 = vcmpps_avx512vl(auVar108,ZEXT1632(auVar93),2);
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          auVar280._8_4_ = 0x7f800000;
          auVar280._0_8_ = 0x7f8000007f800000;
          auVar280._12_4_ = 0x7f800000;
          auVar280._16_4_ = 0x7f800000;
          auVar280._20_4_ = 0x7f800000;
          auVar280._24_4_ = 0x7f800000;
          auVar280._28_4_ = 0x7f800000;
          auVar105 = vblendmps_avx512vl(auVar280,auVar272);
          bVar78 = (byte)uVar80;
          uVar85 = (uint)(bVar78 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar106._0_4_;
          bVar11 = (bool)((byte)(uVar80 >> 1) & 1);
          uVar149 = (uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * auVar106._4_4_;
          bVar11 = (bool)((byte)(uVar80 >> 2) & 1);
          uVar150 = (uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * auVar106._8_4_;
          bVar11 = (bool)((byte)(uVar80 >> 3) & 1);
          uVar151 = (uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * auVar106._12_4_;
          bVar11 = (bool)((byte)(uVar80 >> 4) & 1);
          uVar152 = (uint)bVar11 * auVar105._16_4_ | (uint)!bVar11 * auVar106._16_4_;
          bVar11 = (bool)((byte)(uVar80 >> 5) & 1);
          uVar153 = (uint)bVar11 * auVar105._20_4_ | (uint)!bVar11 * auVar106._20_4_;
          bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
          uVar154 = (uint)bVar11 * auVar105._24_4_ | (uint)!bVar11 * auVar106._24_4_;
          bVar11 = SUB81(uVar80 >> 7,0);
          uVar155 = (uint)bVar11 * auVar105._28_4_ | (uint)!bVar11 * auVar106._28_4_;
          auVar140._0_4_ = (bVar74 & 1) * uVar85 | !(bool)(bVar74 & 1) * auVar140._0_4_;
          bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar140._4_4_ = bVar11 * uVar149 | !bVar11 * auVar140._4_4_;
          bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar140._8_4_ = bVar11 * uVar150 | !bVar11 * auVar140._8_4_;
          bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar140._12_4_ = bVar11 * uVar151 | !bVar11 * auVar140._12_4_;
          bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar140._16_4_ = bVar11 * uVar152 | !bVar11 * auVar140._16_4_;
          bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar140._20_4_ = bVar11 * uVar153 | !bVar11 * auVar140._20_4_;
          bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar140._24_4_ = bVar11 * uVar154 | !bVar11 * auVar140._24_4_;
          bVar11 = SUB81(uVar84 >> 7,0);
          auVar140._28_4_ = bVar11 * uVar155 | !bVar11 * auVar140._28_4_;
          auVar105 = vblendmps_avx512vl(auVar272,auVar280);
          bVar11 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar80 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          bVar17 = SUB81(uVar80 >> 7,0);
          auVar141._0_4_ =
               (uint)(bVar74 & 1) *
               ((uint)(bVar78 & 1) * auVar105._0_4_ | !(bool)(bVar78 & 1) * uVar85) |
               !(bool)(bVar74 & 1) * auVar141._0_4_;
          bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar141._4_4_ =
               (uint)bVar82 * ((uint)bVar11 * auVar105._4_4_ | !bVar11 * uVar149) |
               !bVar82 * auVar141._4_4_;
          bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar141._8_4_ =
               (uint)bVar11 * ((uint)bVar12 * auVar105._8_4_ | !bVar12 * uVar150) |
               !bVar11 * auVar141._8_4_;
          bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar141._12_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar105._12_4_ | !bVar13 * uVar151) |
               !bVar11 * auVar141._12_4_;
          bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar141._16_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar105._16_4_ | !bVar14 * uVar152) |
               !bVar11 * auVar141._16_4_;
          bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar141._20_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar105._20_4_ | !bVar15 * uVar153) |
               !bVar11 * auVar141._20_4_;
          bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar141._24_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar105._24_4_ | !bVar16 * uVar154) |
               !bVar11 * auVar141._24_4_;
          bVar11 = SUB81(uVar84 >> 7,0);
          auVar141._28_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar105._28_4_ | !bVar17 * uVar155) |
               !bVar11 * auVar141._28_4_;
          bVar79 = (~bVar74 | bVar78) & bVar79;
        }
      }
      auVar279._8_4_ = 0x7fffffff;
      auVar279._0_8_ = 0x7fffffff7fffffff;
      auVar279._12_4_ = 0x7fffffff;
      auVar104 = vmulps_avx512vl(local_8c0,auVar104);
      auVar103 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar103);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar109);
      _local_1c0 = _local_700;
      local_1a0 = vminps_avx(local_440,auVar140);
      auVar234 = ZEXT3264(local_1a0);
      auVar260._8_4_ = 0x7fffffff;
      auVar260._0_8_ = 0x7fffffff7fffffff;
      auVar260._12_4_ = 0x7fffffff;
      auVar260._16_4_ = 0x7fffffff;
      auVar260._20_4_ = 0x7fffffff;
      auVar260._24_4_ = 0x7fffffff;
      auVar260._28_4_ = 0x7fffffff;
      auVar103 = vandps_avx(auVar103,auVar260);
      auVar244 = ZEXT3264(auVar103);
      _local_6c0 = vmaxps_avx(_local_700,auVar141);
      _local_460 = _local_6c0;
      auVar221._8_4_ = 0x3e99999a;
      auVar221._0_8_ = 0x3e99999a3e99999a;
      auVar221._12_4_ = 0x3e99999a;
      auVar221._16_4_ = 0x3e99999a;
      auVar221._20_4_ = 0x3e99999a;
      auVar221._24_4_ = 0x3e99999a;
      auVar221._28_4_ = 0x3e99999a;
      uVar26 = vcmpps_avx512vl(auVar103,auVar221,1);
      uVar27 = vcmpps_avx512vl(_local_700,local_1a0,2);
      bVar74 = (byte)uVar27 & bVar76;
      uVar28 = vcmpps_avx512vl(_local_6c0,local_440,2);
      if ((bVar76 & ((byte)uVar28 | (byte)uVar27)) == 0) {
        auVar276 = ZEXT3264(auVar260);
        auVar278 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar103 = vmulps_avx512vl(local_8c0,auVar110);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar102,auVar103);
        auVar103 = vfmadd213ps_avx512vl(auVar111,auVar101,auVar103);
        auVar103 = vandps_avx(auVar103,auVar260);
        uVar27 = vcmpps_avx512vl(auVar103,auVar221,1);
        bVar78 = (byte)uVar27 | ~bVar79;
        auVar175._8_4_ = 2;
        auVar175._0_8_ = 0x200000002;
        auVar175._12_4_ = 2;
        auVar175._16_4_ = 2;
        auVar175._20_4_ = 2;
        auVar175._24_4_ = 2;
        auVar175._28_4_ = 2;
        auVar43._8_4_ = 3;
        auVar43._0_8_ = 0x300000003;
        auVar43._12_4_ = 3;
        auVar43._16_4_ = 3;
        auVar43._20_4_ = 3;
        auVar43._24_4_ = 3;
        auVar43._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar175,auVar43);
        local_420._0_4_ = (uint)(bVar78 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
        bVar11 = (bool)(bVar78 >> 1 & 1);
        local_420._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar78 >> 2 & 1);
        local_420._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar78 >> 3 & 1);
        local_420._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar78 >> 4 & 1);
        local_420._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar78 >> 5 & 1);
        local_420._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar78 >> 6 & 1);
        local_420._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 2;
        local_420._28_4_ = (uint)(bVar78 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
        local_5c0 = vpbroadcastd_avx512vl();
        uVar27 = vpcmpd_avx512vl(local_5c0,local_420,5);
        bVar78 = (byte)uVar27 & bVar74;
        if (bVar78 != 0) {
          auVar93 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar92 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar94 = vminps_avx(local_740._0_16_,local_780._0_16_);
          auVar95 = vminps_avx(auVar93,auVar94);
          auVar93 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
          auVar94 = vmaxps_avx(auVar92,auVar93);
          auVar92 = vandps_avx(auVar279,auVar95);
          auVar93 = vandps_avx(auVar279,auVar94);
          auVar92 = vmaxps_avx(auVar92,auVar93);
          auVar93 = vmovshdup_avx(auVar92);
          auVar93 = vmaxss_avx(auVar93,auVar92);
          auVar92 = vshufpd_avx(auVar92,auVar92,1);
          auVar92 = vmaxss_avx(auVar92,auVar93);
          fVar253 = auVar92._0_4_ * 1.9073486e-06;
          local_7f0 = vshufps_avx(auVar94,auVar94,0xff);
          local_6a0 = (float)local_700._0_4_ + (float)local_840._0_4_;
          fStack_69c = (float)local_700._4_4_ + (float)local_840._4_4_;
          fStack_698 = fStack_6f8 + fStack_838;
          fStack_694 = fStack_6f4 + fStack_834;
          fStack_690 = fStack_6f0 + fStack_830;
          fStack_68c = fStack_6ec + fStack_82c;
          fStack_688 = fStack_6e8 + fStack_828;
          fStack_684 = fStack_6e4 + fStack_824;
          do {
            auVar176._8_4_ = 0x7f800000;
            auVar176._0_8_ = 0x7f8000007f800000;
            auVar176._12_4_ = 0x7f800000;
            auVar176._16_4_ = 0x7f800000;
            auVar176._20_4_ = 0x7f800000;
            auVar176._24_4_ = 0x7f800000;
            auVar176._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar176,_local_700);
            auVar143._0_4_ =
                 (uint)(bVar78 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 3 & 1);
            auVar143._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 4 & 1);
            auVar143._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 5 & 1);
            auVar143._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar143._24_4_ =
                 (uint)(bVar78 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar143,auVar143,0xb1);
            auVar103 = vminps_avx(auVar143,auVar103);
            auVar104 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar104);
            auVar104 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar104);
            uVar27 = vcmpps_avx512vl(auVar143,auVar103,0);
            bVar71 = (byte)uVar27 & bVar78;
            bVar72 = bVar78;
            if (bVar71 != 0) {
              bVar72 = bVar71;
            }
            iVar29 = 0;
            for (uVar85 = (uint)bVar72; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar29 = iVar29 + 1;
            }
            fVar261 = *(float *)(local_660 + (uint)(iVar29 << 2));
            fVar262 = *(float *)(local_1c0 + (uint)(iVar29 << 2));
            fVar264 = auVar89._0_4_;
            if ((float)local_860._0_4_ < 0.0) {
              fVar264 = sqrtf((float)local_860._0_4_);
            }
            lVar81 = 4;
            do {
              auVar161._4_4_ = fVar262;
              auVar161._0_4_ = fVar262;
              auVar161._8_4_ = fVar262;
              auVar161._12_4_ = fVar262;
              auVar93 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_850);
              fVar277 = 1.0 - fVar261;
              auVar207._0_4_ = local_760._0_4_ * fVar261;
              auVar207._4_4_ = local_760._4_4_ * fVar261;
              auVar207._8_4_ = local_760._8_4_ * fVar261;
              auVar207._12_4_ = local_760._12_4_ * fVar261;
              local_790 = ZEXT416((uint)fVar277);
              auVar229._4_4_ = fVar277;
              auVar229._0_4_ = fVar277;
              auVar229._8_4_ = fVar277;
              auVar229._12_4_ = fVar277;
              auVar92 = vfmadd231ps_fma(auVar207,auVar229,local_720._0_16_);
              auVar238._0_4_ = local_740._0_4_ * fVar261;
              auVar238._4_4_ = local_740._4_4_ * fVar261;
              auVar238._8_4_ = local_740._8_4_ * fVar261;
              auVar238._12_4_ = local_740._12_4_ * fVar261;
              auVar94 = vfmadd231ps_fma(auVar238,auVar229,local_760._0_16_);
              auVar250._0_4_ = fVar261 * (float)local_780._0_4_;
              auVar250._4_4_ = fVar261 * (float)local_780._4_4_;
              auVar250._8_4_ = fVar261 * fStack_778;
              auVar250._12_4_ = fVar261 * fStack_774;
              auVar95 = vfmadd231ps_fma(auVar250,auVar229,local_740._0_16_);
              auVar258._0_4_ = fVar261 * auVar94._0_4_;
              auVar258._4_4_ = fVar261 * auVar94._4_4_;
              auVar258._8_4_ = fVar261 * auVar94._8_4_;
              auVar258._12_4_ = fVar261 * auVar94._12_4_;
              auVar92 = vfmadd231ps_fma(auVar258,auVar229,auVar92);
              auVar208._0_4_ = fVar261 * auVar95._0_4_;
              auVar208._4_4_ = fVar261 * auVar95._4_4_;
              auVar208._8_4_ = fVar261 * auVar95._8_4_;
              auVar208._12_4_ = fVar261 * auVar95._12_4_;
              auVar94 = vfmadd231ps_fma(auVar208,auVar229,auVar94);
              auVar239._0_4_ = fVar261 * auVar94._0_4_;
              auVar239._4_4_ = fVar261 * auVar94._4_4_;
              auVar239._8_4_ = fVar261 * auVar94._8_4_;
              auVar239._12_4_ = fVar261 * auVar94._12_4_;
              auVar95 = vfmadd231ps_fma(auVar239,auVar92,auVar229);
              auVar92 = vsubps_avx(auVar94,auVar92);
              auVar34._8_4_ = 0x40400000;
              auVar34._0_8_ = 0x4040000040400000;
              auVar34._12_4_ = 0x40400000;
              auVar94 = vmulps_avx512vl(auVar92,auVar34);
              local_6e0._0_16_ = auVar95;
              auVar92 = vsubps_avx(auVar93,auVar95);
              local_880._0_16_ = auVar92;
              auVar92 = vdpps_avx(auVar92,auVar92,0x7f);
              local_8a0._0_16_ = auVar92;
              local_9e0 = ZEXT416((uint)fVar261);
              if (auVar92._0_4_ < 0.0) {
                auVar234._0_4_ = sqrtf(auVar92._0_4_);
                auVar234._4_60_ = extraout_var;
                auVar92 = auVar234._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar92,auVar92);
              }
              local_7a0 = vdpps_avx(auVar94,auVar94,0x7f);
              fVar277 = local_7a0._0_4_;
              auVar209._4_12_ = ZEXT812(0) << 0x20;
              auVar209._0_4_ = fVar277;
              auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar209);
              fVar182 = auVar93._0_4_;
              local_7b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar209);
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_7a0,auVar35);
              auVar93 = vfnmadd213ss_fma(local_7b0,local_7a0,ZEXT416(0x40000000));
              uVar85 = auVar92._0_4_;
              if (fVar277 < auVar95._0_4_) {
                auVar244._0_4_ = sqrtf(fVar277);
                auVar244._4_60_ = extraout_var_00;
                auVar92 = ZEXT416(uVar85);
                auVar95 = auVar244._0_16_;
              }
              else {
                auVar95 = vsqrtss_avx512f(local_7a0,local_7a0);
              }
              fVar277 = fVar182 * 1.5 + fVar277 * -0.5 * fVar182 * fVar182 * fVar182;
              auVar162._0_4_ = auVar94._0_4_ * fVar277;
              auVar162._4_4_ = auVar94._4_4_ * fVar277;
              auVar162._8_4_ = auVar94._8_4_ * fVar277;
              auVar162._12_4_ = auVar94._12_4_ * fVar277;
              auVar25 = vdpps_avx(local_880._0_16_,auVar162,0x7f);
              fVar267 = auVar92._0_4_;
              fVar182 = auVar25._0_4_;
              auVar163._0_4_ = fVar182 * fVar182;
              auVar163._4_4_ = auVar25._4_4_ * auVar25._4_4_;
              auVar163._8_4_ = auVar25._8_4_ * auVar25._8_4_;
              auVar163._12_4_ = auVar25._12_4_ * auVar25._12_4_;
              auVar96 = vsubps_avx512vl(local_8a0._0_16_,auVar163);
              fVar266 = auVar96._0_4_;
              auVar186._4_12_ = ZEXT812(0) << 0x20;
              auVar186._0_4_ = fVar266;
              auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
              auVar97 = vmulss_avx512f(auVar91,ZEXT416(0x3fc00000));
              auVar98 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
              if (fVar266 < 0.0) {
                local_7d0 = fVar277;
                fStack_7cc = fVar277;
                fStack_7c8 = fVar277;
                fStack_7c4 = fVar277;
                local_7c0 = auVar91;
                fVar266 = sqrtf(fVar266);
                auVar98 = ZEXT416(auVar98._0_4_);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar92 = ZEXT416(uVar85);
                auVar91 = local_7c0;
                fVar277 = local_7d0;
                fVar268 = fStack_7cc;
                fVar263 = fStack_7c8;
                fVar265 = fStack_7c4;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar266 = auVar96._0_4_;
                fVar268 = fVar277;
                fVar263 = fVar277;
                fVar265 = fVar277;
              }
              auVar279._8_4_ = 0x7fffffff;
              auVar279._0_8_ = 0x7fffffff7fffffff;
              auVar279._12_4_ = 0x7fffffff;
              auVar282 = ZEXT3264(local_8c0);
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_790);
              fVar181 = auVar96._0_4_ * 6.0;
              fVar24 = fVar261 * 6.0;
              auVar210._0_4_ = fVar24 * (float)local_780._0_4_;
              auVar210._4_4_ = fVar24 * (float)local_780._4_4_;
              auVar210._8_4_ = fVar24 * fStack_778;
              auVar210._12_4_ = fVar24 * fStack_774;
              auVar187._4_4_ = fVar181;
              auVar187._0_4_ = fVar181;
              auVar187._8_4_ = fVar181;
              auVar187._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar187,auVar210,local_740._0_16_);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_790,local_9e0);
              fVar181 = auVar100._0_4_ * 6.0;
              auVar211._4_4_ = fVar181;
              auVar211._0_4_ = fVar181;
              auVar211._8_4_ = fVar181;
              auVar211._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar211,auVar96,local_760._0_16_);
              fVar181 = local_790._0_4_ * 6.0;
              auVar188._4_4_ = fVar181;
              auVar188._0_4_ = fVar181;
              auVar188._8_4_ = fVar181;
              auVar188._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar188,auVar96,local_720._0_16_);
              auVar212._0_4_ = auVar96._0_4_ * (float)local_7a0._0_4_;
              auVar212._4_4_ = auVar96._4_4_ * (float)local_7a0._0_4_;
              auVar212._8_4_ = auVar96._8_4_ * (float)local_7a0._0_4_;
              auVar212._12_4_ = auVar96._12_4_ * (float)local_7a0._0_4_;
              auVar96 = vdpps_avx(auVar94,auVar96,0x7f);
              fVar181 = auVar96._0_4_;
              auVar189._0_4_ = auVar94._0_4_ * fVar181;
              auVar189._4_4_ = auVar94._4_4_ * fVar181;
              auVar189._8_4_ = auVar94._8_4_ * fVar181;
              auVar189._12_4_ = auVar94._12_4_ * fVar181;
              auVar96 = vsubps_avx(auVar212,auVar189);
              fVar181 = auVar93._0_4_ * (float)local_7b0._0_4_;
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar145._16_16_ = local_8c0._16_16_;
              auVar99 = vxorps_avx512vl(auVar94,auVar36);
              auVar240._0_4_ = fVar277 * auVar96._0_4_ * fVar181;
              auVar240._4_4_ = fVar268 * auVar96._4_4_ * fVar181;
              auVar240._8_4_ = fVar263 * auVar96._8_4_ * fVar181;
              auVar240._12_4_ = fVar265 * auVar96._12_4_ * fVar181;
              auVar93 = vdpps_avx(auVar99,auVar162,0x7f);
              auVar96 = vmaxss_avx(ZEXT416((uint)fVar253),
                                   ZEXT416((uint)(fVar262 * fVar264 * 1.9073486e-06)));
              auVar100 = vdivss_avx512f(ZEXT416((uint)fVar253),auVar95);
              auVar95 = vdpps_avx(local_880._0_16_,auVar240,0x7f);
              auVar92 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar253),auVar96);
              auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar267 + 1.0)),auVar100,auVar92);
              auVar92 = vdpps_avx(local_850,auVar162,0x7f);
              fVar277 = auVar93._0_4_ + auVar95._0_4_;
              auVar93 = vdpps_avx(local_880._0_16_,auVar99,0x7f);
              auVar98 = vmulss_avx512f(auVar98,auVar91);
              auVar91 = vmulss_avx512f(auVar91,auVar91);
              auVar95 = vdpps_avx(local_880._0_16_,local_850,0x7f);
              auVar98 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar98._0_4_ * auVar91._0_4_)));
              auVar91 = vfnmadd231ss_fma(auVar93,auVar25,ZEXT416((uint)fVar277));
              auVar97 = vfnmadd231ss_fma(auVar95,auVar25,auVar92);
              auVar93 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar266 = fVar266 - auVar93._0_4_;
              auVar93 = vshufps_avx(auVar94,auVar94,0xff);
              auVar95 = vfmsub213ss_fma(auVar91,auVar98,auVar93);
              fVar267 = auVar97._0_4_ * auVar98._0_4_;
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar95._0_4_)),
                                        ZEXT416((uint)fVar277),ZEXT416((uint)fVar267));
              fVar268 = auVar91._0_4_;
              fVar277 = fVar266 * (fVar277 / fVar268) - fVar182 * (auVar95._0_4_ / fVar268);
              auVar244 = ZEXT464((uint)fVar277);
              fVar261 = fVar261 - (fVar182 * (fVar267 / fVar268) -
                                  fVar266 * (auVar92._0_4_ / fVar268));
              fVar262 = fVar262 - fVar277;
              auVar92 = vandps_avx(auVar25,auVar279);
              if (auVar100._0_4_ <= auVar92._0_4_) {
LAB_01c739fc:
                bVar11 = false;
              }
              else {
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar100._0_4_ + auVar96._0_4_)),local_7f0,
                                          ZEXT416(0x36000000));
                auVar92 = vandps_avx(auVar279,ZEXT416((uint)fVar266));
                if (auVar95._0_4_ <= auVar92._0_4_) goto LAB_01c739fc;
                fVar262 = fVar262 + (float)local_7e0._0_4_;
                bVar11 = true;
                if (fVar156 <= fVar262) {
                  fVar277 = *(float *)(ray + k * 4 + 0x100);
                  auVar244 = ZEXT464((uint)fVar277);
                  if (((fVar262 <= fVar277) && (0.0 <= fVar261)) && (fVar261 <= 1.0)) {
                    auVar145._0_16_ = ZEXT816(0) << 0x20;
                    auVar144._4_28_ = auVar145._4_28_;
                    auVar144._0_4_ = local_8a0._0_4_;
                    auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar144._0_16_);
                    fVar182 = auVar92._0_4_;
                    auVar92 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar75].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01c73cc1:
                      auVar244 = ZEXT464((uint)fVar277);
                    }
                    else {
                      fVar182 = fVar182 * 1.5 + auVar92._0_4_ * fVar182 * fVar182 * fVar182;
                      auVar190._0_4_ = local_880._0_4_ * fVar182;
                      auVar190._4_4_ = local_880._4_4_ * fVar182;
                      auVar190._8_4_ = local_880._8_4_ * fVar182;
                      auVar190._12_4_ = local_880._12_4_ * fVar182;
                      auVar95 = vfmadd213ps_fma(auVar93,auVar190,auVar94);
                      auVar92 = vshufps_avx(auVar190,auVar190,0xc9);
                      auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar191._0_4_ = auVar190._0_4_ * auVar93._0_4_;
                      auVar191._4_4_ = auVar190._4_4_ * auVar93._4_4_;
                      auVar191._8_4_ = auVar190._8_4_ * auVar93._8_4_;
                      auVar191._12_4_ = auVar190._12_4_ * auVar93._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar191,auVar94,auVar92);
                      auVar92 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar93 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                      auVar164._0_4_ = auVar95._0_4_ * auVar94._0_4_;
                      auVar164._4_4_ = auVar95._4_4_ * auVar94._4_4_;
                      auVar164._8_4_ = auVar95._8_4_ * auVar94._8_4_;
                      auVar164._12_4_ = auVar95._12_4_ * auVar94._12_4_;
                      auVar92 = vfmsub231ps_fma(auVar164,auVar92,auVar93);
                      uVar273 = auVar92._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar262;
                        uVar3 = vextractps_avx(auVar92,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                        uVar3 = vextractps_avx(auVar92,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar273;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar261;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_8c8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar75;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar222._8_4_ = 1;
                        auVar222._0_8_ = 0x100000001;
                        auVar222._12_4_ = 1;
                        auVar222._16_4_ = 1;
                        auVar222._20_4_ = 1;
                        auVar222._24_4_ = 1;
                        auVar222._28_4_ = 1;
                        auVar103 = vpermps_avx2(auVar222,ZEXT1632(auVar92));
                        auVar231._8_4_ = 2;
                        auVar231._0_8_ = 0x200000002;
                        auVar231._12_4_ = 2;
                        auVar231._16_4_ = 2;
                        auVar231._20_4_ = 2;
                        auVar231._24_4_ = 2;
                        auVar231._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar231,ZEXT1632(auVar92));
                        local_580[0] = (RTCHitN)auVar103[0];
                        local_580[1] = (RTCHitN)auVar103[1];
                        local_580[2] = (RTCHitN)auVar103[2];
                        local_580[3] = (RTCHitN)auVar103[3];
                        local_580[4] = (RTCHitN)auVar103[4];
                        local_580[5] = (RTCHitN)auVar103[5];
                        local_580[6] = (RTCHitN)auVar103[6];
                        local_580[7] = (RTCHitN)auVar103[7];
                        local_580[8] = (RTCHitN)auVar103[8];
                        local_580[9] = (RTCHitN)auVar103[9];
                        local_580[10] = (RTCHitN)auVar103[10];
                        local_580[0xb] = (RTCHitN)auVar103[0xb];
                        local_580[0xc] = (RTCHitN)auVar103[0xc];
                        local_580[0xd] = (RTCHitN)auVar103[0xd];
                        local_580[0xe] = (RTCHitN)auVar103[0xe];
                        local_580[0xf] = (RTCHitN)auVar103[0xf];
                        local_580[0x10] = (RTCHitN)auVar103[0x10];
                        local_580[0x11] = (RTCHitN)auVar103[0x11];
                        local_580[0x12] = (RTCHitN)auVar103[0x12];
                        local_580[0x13] = (RTCHitN)auVar103[0x13];
                        local_580[0x14] = (RTCHitN)auVar103[0x14];
                        local_580[0x15] = (RTCHitN)auVar103[0x15];
                        local_580[0x16] = (RTCHitN)auVar103[0x16];
                        local_580[0x17] = (RTCHitN)auVar103[0x17];
                        local_580[0x18] = (RTCHitN)auVar103[0x18];
                        local_580[0x19] = (RTCHitN)auVar103[0x19];
                        local_580[0x1a] = (RTCHitN)auVar103[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar103[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar103[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar103[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar103[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar103[0x1f];
                        local_540 = uVar273;
                        uStack_53c = uVar273;
                        uStack_538 = uVar273;
                        uStack_534 = uVar273;
                        uStack_530 = uVar273;
                        uStack_52c = uVar273;
                        uStack_528 = uVar273;
                        uStack_524 = uVar273;
                        local_520 = fVar261;
                        fStack_51c = fVar261;
                        fStack_518 = fVar261;
                        fStack_514 = fVar261;
                        fStack_510 = fVar261;
                        fStack_50c = fVar261;
                        fStack_508 = fVar261;
                        fStack_504 = fVar261;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_600._0_8_;
                        uStack_4d8 = local_600._8_8_;
                        uStack_4d0 = local_600._16_8_;
                        uStack_4c8 = local_600._24_8_;
                        local_4c0 = local_5e0;
                        auVar103 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8e0[1] = auVar103;
                        *local_8e0 = auVar103;
                        local_4a0 = pRVar10->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar10->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar262;
                        local_820 = local_620._0_8_;
                        uStack_818 = local_620._8_8_;
                        uStack_810 = local_620._16_8_;
                        uStack_808 = local_620._24_8_;
                        local_920.valid = (int *)&local_820;
                        local_920.geometryUserPtr = pGVar4->userPtr;
                        local_920.context = context->user;
                        local_920.hit = local_580;
                        local_920.N = 8;
                        local_920.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_920);
                          auVar282 = ZEXT3264(local_8c0);
                          auVar279._8_4_ = 0x7fffffff;
                          auVar279._0_8_ = 0x7fffffff7fffffff;
                          auVar279._12_4_ = 0x7fffffff;
                        }
                        auVar64._8_8_ = uStack_818;
                        auVar64._0_8_ = local_820;
                        auVar64._16_8_ = uStack_810;
                        auVar64._24_8_ = uStack_808;
                        if (auVar64 != (undefined1  [32])0x0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_920);
                            auVar282 = ZEXT3264(local_8c0);
                            auVar279._8_4_ = 0x7fffffff;
                            auVar279._0_8_ = 0x7fffffff7fffffff;
                            auVar279._12_4_ = 0x7fffffff;
                          }
                          auVar65._8_8_ = uStack_818;
                          auVar65._0_8_ = local_820;
                          auVar65._16_8_ = uStack_810;
                          auVar65._24_8_ = uStack_808;
                          if (auVar65 != (undefined1  [32])0x0) {
                            uVar84 = vptestmd_avx512vl(auVar65,auVar65);
                            iVar57 = *(int *)(local_920.hit + 4);
                            iVar58 = *(int *)(local_920.hit + 8);
                            iVar59 = *(int *)(local_920.hit + 0xc);
                            iVar60 = *(int *)(local_920.hit + 0x10);
                            iVar61 = *(int *)(local_920.hit + 0x14);
                            iVar62 = *(int *)(local_920.hit + 0x18);
                            iVar63 = *(int *)(local_920.hit + 0x1c);
                            bVar72 = (byte)uVar84;
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x180) =
                                 (uint)(bVar72 & 1) * *(int *)local_920.hit |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_920.ray + 0x180);
                            *(uint *)(local_920.ray + 0x184) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x184);
                            *(uint *)(local_920.ray + 0x188) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x188);
                            *(uint *)(local_920.ray + 0x18c) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x18c);
                            *(uint *)(local_920.ray + 400) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 400);
                            *(uint *)(local_920.ray + 0x194) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x194);
                            *(uint *)(local_920.ray + 0x198) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x198);
                            *(uint *)(local_920.ray + 0x19c) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x19c);
                            iVar57 = *(int *)(local_920.hit + 0x24);
                            iVar58 = *(int *)(local_920.hit + 0x28);
                            iVar59 = *(int *)(local_920.hit + 0x2c);
                            iVar60 = *(int *)(local_920.hit + 0x30);
                            iVar61 = *(int *)(local_920.hit + 0x34);
                            iVar62 = *(int *)(local_920.hit + 0x38);
                            iVar63 = *(int *)(local_920.hit + 0x3c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1a0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_920.hit + 0x20) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_920.ray + 0x1a0);
                            *(uint *)(local_920.ray + 0x1a4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1a4);
                            *(uint *)(local_920.ray + 0x1a8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1a8);
                            *(uint *)(local_920.ray + 0x1ac) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1ac);
                            *(uint *)(local_920.ray + 0x1b0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1b0);
                            *(uint *)(local_920.ray + 0x1b4) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x1b4);
                            *(uint *)(local_920.ray + 0x1b8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1b8);
                            *(uint *)(local_920.ray + 0x1bc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1bc);
                            iVar57 = *(int *)(local_920.hit + 0x44);
                            iVar58 = *(int *)(local_920.hit + 0x48);
                            iVar59 = *(int *)(local_920.hit + 0x4c);
                            iVar60 = *(int *)(local_920.hit + 0x50);
                            iVar61 = *(int *)(local_920.hit + 0x54);
                            iVar62 = *(int *)(local_920.hit + 0x58);
                            iVar63 = *(int *)(local_920.hit + 0x5c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1c0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_920.hit + 0x40) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_920.ray + 0x1c0);
                            *(uint *)(local_920.ray + 0x1c4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1c4);
                            *(uint *)(local_920.ray + 0x1c8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1c8);
                            *(uint *)(local_920.ray + 0x1cc) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1cc);
                            *(uint *)(local_920.ray + 0x1d0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1d0);
                            *(uint *)(local_920.ray + 0x1d4) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x1d4);
                            *(uint *)(local_920.ray + 0x1d8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1d8);
                            *(uint *)(local_920.ray + 0x1dc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1dc);
                            iVar57 = *(int *)(local_920.hit + 100);
                            iVar58 = *(int *)(local_920.hit + 0x68);
                            iVar59 = *(int *)(local_920.hit + 0x6c);
                            iVar60 = *(int *)(local_920.hit + 0x70);
                            iVar61 = *(int *)(local_920.hit + 0x74);
                            iVar62 = *(int *)(local_920.hit + 0x78);
                            iVar63 = *(int *)(local_920.hit + 0x7c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1e0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_920.hit + 0x60) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_920.ray + 0x1e0);
                            *(uint *)(local_920.ray + 0x1e4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1e4);
                            *(uint *)(local_920.ray + 0x1e8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1e8);
                            *(uint *)(local_920.ray + 0x1ec) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1ec);
                            *(uint *)(local_920.ray + 0x1f0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1f0);
                            *(uint *)(local_920.ray + 500) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 500);
                            *(uint *)(local_920.ray + 0x1f8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1f8);
                            *(uint *)(local_920.ray + 0x1fc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1fc);
                            iVar57 = *(int *)(local_920.hit + 0x84);
                            iVar58 = *(int *)(local_920.hit + 0x88);
                            iVar59 = *(int *)(local_920.hit + 0x8c);
                            iVar60 = *(int *)(local_920.hit + 0x90);
                            iVar61 = *(int *)(local_920.hit + 0x94);
                            iVar62 = *(int *)(local_920.hit + 0x98);
                            iVar63 = *(int *)(local_920.hit + 0x9c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x200) =
                                 (uint)(bVar72 & 1) * *(int *)(local_920.hit + 0x80) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_920.ray + 0x200);
                            *(uint *)(local_920.ray + 0x204) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x204);
                            *(uint *)(local_920.ray + 0x208) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x208);
                            *(uint *)(local_920.ray + 0x20c) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x20c);
                            *(uint *)(local_920.ray + 0x210) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x210);
                            *(uint *)(local_920.ray + 0x214) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x214);
                            *(uint *)(local_920.ray + 0x218) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x218);
                            *(uint *)(local_920.ray + 0x21c) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x21c);
                            auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xa0));
                            *(undefined1 (*) [32])(local_920.ray + 0x220) = auVar103;
                            auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xc0));
                            *(undefined1 (*) [32])(local_920.ray + 0x240) = auVar103;
                            auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xe0));
                            *(undefined1 (*) [32])(local_920.ray + 0x260) = auVar103;
                            auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0x100));
                            *(undefined1 (*) [32])(local_920.ray + 0x280) = auVar103;
                            goto LAB_01c73cc1;
                          }
                        }
                        auVar244 = ZEXT464((uint)fVar277);
                        *(float *)(ray + k * 4 + 0x100) = fVar277;
                      }
                    }
                  }
                }
              }
              bVar82 = lVar81 != 0;
              lVar81 = lVar81 + -1;
            } while ((!bVar11) && (bVar82));
            auVar68._4_4_ = fStack_69c;
            auVar68._0_4_ = local_6a0;
            auVar68._8_4_ = fStack_698;
            auVar68._12_4_ = fStack_694;
            auVar68._16_4_ = fStack_690;
            auVar68._20_4_ = fStack_68c;
            auVar68._24_4_ = fStack_688;
            auVar68._28_4_ = fStack_684;
            uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar44._4_4_ = uVar273;
            auVar44._0_4_ = uVar273;
            auVar44._8_4_ = uVar273;
            auVar44._12_4_ = uVar273;
            auVar44._16_4_ = uVar273;
            auVar44._20_4_ = uVar273;
            auVar44._24_4_ = uVar273;
            auVar44._28_4_ = uVar273;
            uVar27 = vcmpps_avx512vl(auVar68,auVar44,2);
            bVar78 = ~('\x01' << ((byte)iVar29 & 0x1f)) & bVar78 & (byte)uVar27;
          } while (bVar78 != 0);
        }
        auVar177._0_4_ = (float)local_6c0._0_4_ + (float)local_840._0_4_;
        auVar177._4_4_ = (float)local_6c0._4_4_ + (float)local_840._4_4_;
        auVar177._8_4_ = fStack_6b8 + fStack_838;
        auVar177._12_4_ = fStack_6b4 + fStack_834;
        auVar177._16_4_ = fStack_6b0 + fStack_830;
        auVar177._20_4_ = fStack_6ac + fStack_82c;
        auVar177._24_4_ = fStack_6a8 + fStack_828;
        auVar177._28_4_ = fStack_6a4 + fStack_824;
        uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar45._4_4_ = uVar273;
        auVar45._0_4_ = uVar273;
        auVar45._8_4_ = uVar273;
        auVar45._12_4_ = uVar273;
        auVar45._16_4_ = uVar273;
        auVar45._20_4_ = uVar273;
        auVar45._24_4_ = uVar273;
        auVar45._28_4_ = uVar273;
        uVar27 = vcmpps_avx512vl(auVar177,auVar45,2);
        bVar79 = (byte)uVar26 | ~bVar79;
        bVar76 = (byte)uVar28 & bVar76 & (byte)uVar27;
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar46._8_4_ = 3;
        auVar46._0_8_ = 0x300000003;
        auVar46._12_4_ = 3;
        auVar46._16_4_ = 3;
        auVar46._20_4_ = 3;
        auVar46._24_4_ = 3;
        auVar46._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar178,auVar46);
        local_6c0._0_4_ = (uint)(bVar79 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar11 = (bool)(bVar79 >> 1 & 1);
        local_6c0._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 2 & 1);
        fStack_6b8 = (float)((uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 2);
        bVar11 = (bool)(bVar79 >> 3 & 1);
        fStack_6b4 = (float)((uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 2);
        bVar11 = (bool)(bVar79 >> 4 & 1);
        fStack_6b0 = (float)((uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 2);
        bVar11 = (bool)(bVar79 >> 5 & 1);
        fStack_6ac = (float)((uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 2);
        bVar11 = (bool)(bVar79 >> 6 & 1);
        fStack_6a8 = (float)((uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * 2);
        fStack_6a4 = (float)((uint)(bVar79 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2)
        ;
        uVar26 = vpcmpd_avx512vl(_local_6c0,local_5c0,2);
        bVar79 = (byte)uVar26 & bVar76;
        if (bVar79 != 0) {
          auVar93 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar92 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar94 = vminps_avx(local_740._0_16_,local_780._0_16_);
          auVar95 = vminps_avx(auVar93,auVar94);
          auVar93 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
          auVar94 = vmaxps_avx(auVar92,auVar93);
          auVar92 = vandps_avx(auVar279,auVar95);
          auVar93 = vandps_avx(auVar279,auVar94);
          auVar92 = vmaxps_avx(auVar92,auVar93);
          auVar93 = vmovshdup_avx(auVar92);
          auVar93 = vmaxss_avx(auVar93,auVar92);
          auVar92 = vshufpd_avx(auVar92,auVar92,1);
          auVar92 = vmaxss_avx(auVar92,auVar93);
          fVar253 = auVar92._0_4_ * 1.9073486e-06;
          local_7f0 = vshufps_avx(auVar94,auVar94,0xff);
          _local_700 = _local_460;
          local_6a0 = (float)local_460._0_4_ + (float)local_840._0_4_;
          fStack_69c = (float)local_460._4_4_ + (float)local_840._4_4_;
          fStack_698 = fStack_458 + fStack_838;
          fStack_694 = fStack_454 + fStack_834;
          fStack_690 = fStack_450 + fStack_830;
          fStack_68c = fStack_44c + fStack_82c;
          fStack_688 = fStack_448 + fStack_828;
          fStack_684 = fStack_444 + fStack_824;
          do {
            auVar179._8_4_ = 0x7f800000;
            auVar179._0_8_ = 0x7f8000007f800000;
            auVar179._12_4_ = 0x7f800000;
            auVar179._16_4_ = 0x7f800000;
            auVar179._20_4_ = 0x7f800000;
            auVar179._24_4_ = 0x7f800000;
            auVar179._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar179,_local_700);
            auVar146._0_4_ =
                 (uint)(bVar79 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 1 & 1);
            auVar146._4_4_ = (uint)bVar11 * auVar103._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 2 & 1);
            auVar146._8_4_ = (uint)bVar11 * auVar103._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 3 & 1);
            auVar146._12_4_ = (uint)bVar11 * auVar103._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 4 & 1);
            auVar146._16_4_ = (uint)bVar11 * auVar103._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 5 & 1);
            auVar146._20_4_ = (uint)bVar11 * auVar103._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar146._24_4_ =
                 (uint)(bVar79 >> 6) * auVar103._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar103 = vshufps_avx(auVar146,auVar146,0xb1);
            auVar103 = vminps_avx(auVar146,auVar103);
            auVar104 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar104);
            auVar104 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar104);
            uVar26 = vcmpps_avx512vl(auVar146,auVar103,0);
            bVar72 = (byte)uVar26 & bVar79;
            bVar78 = bVar79;
            if (bVar72 != 0) {
              bVar78 = bVar72;
            }
            iVar29 = 0;
            for (uVar85 = (uint)bVar78; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar29 = iVar29 + 1;
            }
            fVar261 = *(float *)(local_680 + (uint)(iVar29 << 2));
            fVar262 = *(float *)(local_440 + (uint)(iVar29 << 2));
            fVar264 = auVar90._0_4_;
            if ((float)local_860._0_4_ < 0.0) {
              fVar264 = sqrtf((float)local_860._0_4_);
            }
            lVar81 = 4;
            do {
              auVar165._4_4_ = fVar262;
              auVar165._0_4_ = fVar262;
              auVar165._8_4_ = fVar262;
              auVar165._12_4_ = fVar262;
              auVar93 = vfmadd132ps_fma(auVar165,ZEXT816(0) << 0x40,local_850);
              fVar277 = 1.0 - fVar261;
              auVar213._0_4_ = local_760._0_4_ * fVar261;
              auVar213._4_4_ = local_760._4_4_ * fVar261;
              auVar213._8_4_ = local_760._8_4_ * fVar261;
              auVar213._12_4_ = local_760._12_4_ * fVar261;
              local_790 = ZEXT416((uint)fVar277);
              auVar230._4_4_ = fVar277;
              auVar230._0_4_ = fVar277;
              auVar230._8_4_ = fVar277;
              auVar230._12_4_ = fVar277;
              auVar92 = vfmadd231ps_fma(auVar213,auVar230,local_720._0_16_);
              auVar241._0_4_ = local_740._0_4_ * fVar261;
              auVar241._4_4_ = local_740._4_4_ * fVar261;
              auVar241._8_4_ = local_740._8_4_ * fVar261;
              auVar241._12_4_ = local_740._12_4_ * fVar261;
              auVar94 = vfmadd231ps_fma(auVar241,auVar230,local_760._0_16_);
              auVar251._0_4_ = fVar261 * (float)local_780._0_4_;
              auVar251._4_4_ = fVar261 * (float)local_780._4_4_;
              auVar251._8_4_ = fVar261 * fStack_778;
              auVar251._12_4_ = fVar261 * fStack_774;
              auVar95 = vfmadd231ps_fma(auVar251,auVar230,local_740._0_16_);
              auVar259._0_4_ = fVar261 * auVar94._0_4_;
              auVar259._4_4_ = fVar261 * auVar94._4_4_;
              auVar259._8_4_ = fVar261 * auVar94._8_4_;
              auVar259._12_4_ = fVar261 * auVar94._12_4_;
              auVar92 = vfmadd231ps_fma(auVar259,auVar230,auVar92);
              auVar214._0_4_ = fVar261 * auVar95._0_4_;
              auVar214._4_4_ = fVar261 * auVar95._4_4_;
              auVar214._8_4_ = fVar261 * auVar95._8_4_;
              auVar214._12_4_ = fVar261 * auVar95._12_4_;
              auVar94 = vfmadd231ps_fma(auVar214,auVar230,auVar94);
              auVar242._0_4_ = fVar261 * auVar94._0_4_;
              auVar242._4_4_ = fVar261 * auVar94._4_4_;
              auVar242._8_4_ = fVar261 * auVar94._8_4_;
              auVar242._12_4_ = fVar261 * auVar94._12_4_;
              auVar95 = vfmadd231ps_fma(auVar242,auVar92,auVar230);
              auVar92 = vsubps_avx(auVar94,auVar92);
              auVar37._8_4_ = 0x40400000;
              auVar37._0_8_ = 0x4040000040400000;
              auVar37._12_4_ = 0x40400000;
              auVar94 = vmulps_avx512vl(auVar92,auVar37);
              local_6e0._0_16_ = auVar95;
              auVar92 = vsubps_avx(auVar93,auVar95);
              local_880._0_16_ = auVar92;
              auVar92 = vdpps_avx(auVar92,auVar92,0x7f);
              local_8a0._0_16_ = auVar92;
              local_9e0 = ZEXT416((uint)fVar261);
              if (auVar92._0_4_ < 0.0) {
                auVar282._0_4_ = sqrtf(auVar92._0_4_);
                auVar282._4_60_ = extraout_var_01;
                auVar92 = auVar282._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar92,auVar92);
              }
              local_7a0 = vdpps_avx(auVar94,auVar94,0x7f);
              fVar277 = local_7a0._0_4_;
              auVar215._4_12_ = ZEXT812(0) << 0x20;
              auVar215._0_4_ = fVar277;
              auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar215);
              fVar182 = auVar93._0_4_;
              local_7b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar215);
              auVar38._8_4_ = 0x80000000;
              auVar38._0_8_ = 0x8000000080000000;
              auVar38._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_7a0,auVar38);
              auVar93 = vfnmadd213ss_fma(local_7b0,local_7a0,ZEXT416(0x40000000));
              uVar85 = auVar92._0_4_;
              if (fVar277 < auVar95._0_4_) {
                auVar180._0_4_ = sqrtf(fVar277);
                auVar180._4_60_ = extraout_var_02;
                auVar92 = ZEXT416(uVar85);
                auVar95 = auVar180._0_16_;
              }
              else {
                auVar95 = vsqrtss_avx512f(local_7a0,local_7a0);
              }
              fVar277 = fVar182 * 1.5 + fVar277 * -0.5 * fVar182 * fVar182 * fVar182;
              auVar166._0_4_ = auVar94._0_4_ * fVar277;
              auVar166._4_4_ = auVar94._4_4_ * fVar277;
              auVar166._8_4_ = auVar94._8_4_ * fVar277;
              auVar166._12_4_ = auVar94._12_4_ * fVar277;
              auVar25 = vdpps_avx(local_880._0_16_,auVar166,0x7f);
              fVar267 = auVar92._0_4_;
              fVar182 = auVar25._0_4_;
              auVar167._0_4_ = fVar182 * fVar182;
              auVar167._4_4_ = auVar25._4_4_ * auVar25._4_4_;
              auVar167._8_4_ = auVar25._8_4_ * auVar25._8_4_;
              auVar167._12_4_ = auVar25._12_4_ * auVar25._12_4_;
              auVar96 = vsubps_avx512vl(local_8a0._0_16_,auVar167);
              fVar266 = auVar96._0_4_;
              auVar192._4_12_ = ZEXT812(0) << 0x20;
              auVar192._0_4_ = fVar266;
              auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              auVar97 = vmulss_avx512f(auVar91,ZEXT416(0x3fc00000));
              auVar98 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
              if (fVar266 < 0.0) {
                local_7d0 = fVar277;
                fStack_7cc = fVar277;
                fStack_7c8 = fVar277;
                fStack_7c4 = fVar277;
                local_7c0 = auVar91;
                fVar266 = sqrtf(fVar266);
                auVar98 = ZEXT416(auVar98._0_4_);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar92 = ZEXT416(uVar85);
                auVar91 = local_7c0;
                fVar277 = local_7d0;
                fVar268 = fStack_7cc;
                fVar263 = fStack_7c8;
                fVar265 = fStack_7c4;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar266 = auVar96._0_4_;
                fVar268 = fVar277;
                fVar263 = fVar277;
                fVar265 = fVar277;
              }
              auVar275._8_4_ = 0x7fffffff;
              auVar275._0_8_ = 0x7fffffff7fffffff;
              auVar275._12_4_ = 0x7fffffff;
              auVar282 = ZEXT3264(local_8c0);
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_790);
              fVar181 = auVar96._0_4_ * 6.0;
              fVar24 = fVar261 * 6.0;
              auVar216._0_4_ = fVar24 * (float)local_780._0_4_;
              auVar216._4_4_ = fVar24 * (float)local_780._4_4_;
              auVar216._8_4_ = fVar24 * fStack_778;
              auVar216._12_4_ = fVar24 * fStack_774;
              auVar193._4_4_ = fVar181;
              auVar193._0_4_ = fVar181;
              auVar193._8_4_ = fVar181;
              auVar193._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar193,auVar216,local_740._0_16_);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_790,local_9e0);
              fVar181 = auVar100._0_4_ * 6.0;
              auVar217._4_4_ = fVar181;
              auVar217._0_4_ = fVar181;
              auVar217._8_4_ = fVar181;
              auVar217._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar217,auVar96,local_760._0_16_);
              fVar181 = local_790._0_4_ * 6.0;
              auVar194._4_4_ = fVar181;
              auVar194._0_4_ = fVar181;
              auVar194._8_4_ = fVar181;
              auVar194._12_4_ = fVar181;
              auVar96 = vfmadd132ps_fma(auVar194,auVar96,local_720._0_16_);
              auVar218._0_4_ = auVar96._0_4_ * (float)local_7a0._0_4_;
              auVar218._4_4_ = auVar96._4_4_ * (float)local_7a0._0_4_;
              auVar218._8_4_ = auVar96._8_4_ * (float)local_7a0._0_4_;
              auVar218._12_4_ = auVar96._12_4_ * (float)local_7a0._0_4_;
              auVar96 = vdpps_avx(auVar94,auVar96,0x7f);
              fVar181 = auVar96._0_4_;
              auVar195._0_4_ = auVar94._0_4_ * fVar181;
              auVar195._4_4_ = auVar94._4_4_ * fVar181;
              auVar195._8_4_ = auVar94._8_4_ * fVar181;
              auVar195._12_4_ = auVar94._12_4_ * fVar181;
              auVar96 = vsubps_avx(auVar218,auVar195);
              fVar181 = auVar93._0_4_ * (float)local_7b0._0_4_;
              auVar39._8_4_ = 0x80000000;
              auVar39._0_8_ = 0x8000000080000000;
              auVar39._12_4_ = 0x80000000;
              auVar148._16_16_ = local_8c0._16_16_;
              auVar99 = vxorps_avx512vl(auVar94,auVar39);
              auVar243._0_4_ = fVar277 * auVar96._0_4_ * fVar181;
              auVar243._4_4_ = fVar268 * auVar96._4_4_ * fVar181;
              auVar243._8_4_ = fVar263 * auVar96._8_4_ * fVar181;
              auVar243._12_4_ = fVar265 * auVar96._12_4_ * fVar181;
              auVar93 = vdpps_avx(auVar99,auVar166,0x7f);
              auVar96 = vmaxss_avx(ZEXT416((uint)fVar253),
                                   ZEXT416((uint)(fVar262 * fVar264 * 1.9073486e-06)));
              auVar100 = vdivss_avx512f(ZEXT416((uint)fVar253),auVar95);
              auVar95 = vdpps_avx(local_880._0_16_,auVar243,0x7f);
              auVar92 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar253),auVar96);
              auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar267 + 1.0)),auVar100,auVar92);
              auVar92 = vdpps_avx(local_850,auVar166,0x7f);
              fVar277 = auVar93._0_4_ + auVar95._0_4_;
              auVar93 = vdpps_avx(local_880._0_16_,auVar99,0x7f);
              auVar98 = vmulss_avx512f(auVar98,auVar91);
              auVar91 = vmulss_avx512f(auVar91,auVar91);
              auVar95 = vdpps_avx(local_880._0_16_,local_850,0x7f);
              auVar98 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar98._0_4_ * auVar91._0_4_)));
              auVar91 = vfnmadd231ss_fma(auVar93,auVar25,ZEXT416((uint)fVar277));
              auVar97 = vfnmadd231ss_fma(auVar95,auVar25,auVar92);
              auVar93 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar266 = fVar266 - auVar93._0_4_;
              auVar93 = vshufps_avx(auVar94,auVar94,0xff);
              auVar95 = vfmsub213ss_fma(auVar91,auVar98,auVar93);
              fVar267 = auVar97._0_4_ * auVar98._0_4_;
              auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar95._0_4_)),
                                        ZEXT416((uint)fVar277),ZEXT416((uint)fVar267));
              fVar268 = auVar91._0_4_;
              fVar277 = fVar266 * (fVar277 / fVar268) - fVar182 * (auVar95._0_4_ / fVar268);
              auVar244 = ZEXT464((uint)fVar277);
              fVar261 = fVar261 - (fVar182 * (fVar267 / fVar268) -
                                  fVar266 * (auVar92._0_4_ / fVar268));
              fVar262 = fVar262 - fVar277;
              auVar92 = vandps_avx(auVar25,auVar275);
              if (auVar100._0_4_ <= auVar92._0_4_) {
LAB_01c7451c:
                bVar11 = false;
              }
              else {
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar100._0_4_ + auVar96._0_4_)),local_7f0,
                                          ZEXT416(0x36000000));
                auVar92 = vandps_avx(auVar275,ZEXT416((uint)fVar266));
                if (auVar95._0_4_ <= auVar92._0_4_) goto LAB_01c7451c;
                fVar262 = fVar262 + (float)local_7e0._0_4_;
                bVar11 = true;
                if (fVar156 <= fVar262) {
                  fVar277 = *(float *)(ray + k * 4 + 0x100);
                  auVar244 = ZEXT464((uint)fVar277);
                  if (((fVar262 <= fVar277) && (0.0 <= fVar261)) && (fVar261 <= 1.0)) {
                    auVar148._0_16_ = ZEXT816(0) << 0x20;
                    auVar147._4_28_ = auVar148._4_28_;
                    auVar147._0_4_ = local_8a0._0_4_;
                    auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar147._0_16_);
                    fVar182 = auVar92._0_4_;
                    auVar92 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar75].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01c747cf:
                      auVar244 = ZEXT464((uint)fVar277);
                    }
                    else {
                      fVar182 = fVar182 * 1.5 + auVar92._0_4_ * fVar182 * fVar182 * fVar182;
                      auVar196._0_4_ = local_880._0_4_ * fVar182;
                      auVar196._4_4_ = local_880._4_4_ * fVar182;
                      auVar196._8_4_ = local_880._8_4_ * fVar182;
                      auVar196._12_4_ = local_880._12_4_ * fVar182;
                      auVar95 = vfmadd213ps_fma(auVar93,auVar196,auVar94);
                      auVar92 = vshufps_avx(auVar196,auVar196,0xc9);
                      auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar197._0_4_ = auVar196._0_4_ * auVar93._0_4_;
                      auVar197._4_4_ = auVar196._4_4_ * auVar93._4_4_;
                      auVar197._8_4_ = auVar196._8_4_ * auVar93._8_4_;
                      auVar197._12_4_ = auVar196._12_4_ * auVar93._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar197,auVar94,auVar92);
                      auVar92 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar93 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                      auVar168._0_4_ = auVar95._0_4_ * auVar94._0_4_;
                      auVar168._4_4_ = auVar95._4_4_ * auVar94._4_4_;
                      auVar168._8_4_ = auVar95._8_4_ * auVar94._8_4_;
                      auVar168._12_4_ = auVar95._12_4_ * auVar94._12_4_;
                      auVar92 = vfmsub231ps_fma(auVar168,auVar92,auVar93);
                      uVar273 = auVar92._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar262;
                        uVar3 = vextractps_avx(auVar92,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                        uVar3 = vextractps_avx(auVar92,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar273;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar261;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_8c8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar75;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar223._8_4_ = 1;
                        auVar223._0_8_ = 0x100000001;
                        auVar223._12_4_ = 1;
                        auVar223._16_4_ = 1;
                        auVar223._20_4_ = 1;
                        auVar223._24_4_ = 1;
                        auVar223._28_4_ = 1;
                        auVar103 = vpermps_avx2(auVar223,ZEXT1632(auVar92));
                        auVar232._8_4_ = 2;
                        auVar232._0_8_ = 0x200000002;
                        auVar232._12_4_ = 2;
                        auVar232._16_4_ = 2;
                        auVar232._20_4_ = 2;
                        auVar232._24_4_ = 2;
                        auVar232._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar232,ZEXT1632(auVar92));
                        local_580[0] = (RTCHitN)auVar103[0];
                        local_580[1] = (RTCHitN)auVar103[1];
                        local_580[2] = (RTCHitN)auVar103[2];
                        local_580[3] = (RTCHitN)auVar103[3];
                        local_580[4] = (RTCHitN)auVar103[4];
                        local_580[5] = (RTCHitN)auVar103[5];
                        local_580[6] = (RTCHitN)auVar103[6];
                        local_580[7] = (RTCHitN)auVar103[7];
                        local_580[8] = (RTCHitN)auVar103[8];
                        local_580[9] = (RTCHitN)auVar103[9];
                        local_580[10] = (RTCHitN)auVar103[10];
                        local_580[0xb] = (RTCHitN)auVar103[0xb];
                        local_580[0xc] = (RTCHitN)auVar103[0xc];
                        local_580[0xd] = (RTCHitN)auVar103[0xd];
                        local_580[0xe] = (RTCHitN)auVar103[0xe];
                        local_580[0xf] = (RTCHitN)auVar103[0xf];
                        local_580[0x10] = (RTCHitN)auVar103[0x10];
                        local_580[0x11] = (RTCHitN)auVar103[0x11];
                        local_580[0x12] = (RTCHitN)auVar103[0x12];
                        local_580[0x13] = (RTCHitN)auVar103[0x13];
                        local_580[0x14] = (RTCHitN)auVar103[0x14];
                        local_580[0x15] = (RTCHitN)auVar103[0x15];
                        local_580[0x16] = (RTCHitN)auVar103[0x16];
                        local_580[0x17] = (RTCHitN)auVar103[0x17];
                        local_580[0x18] = (RTCHitN)auVar103[0x18];
                        local_580[0x19] = (RTCHitN)auVar103[0x19];
                        local_580[0x1a] = (RTCHitN)auVar103[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar103[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar103[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar103[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar103[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar103[0x1f];
                        local_540 = uVar273;
                        uStack_53c = uVar273;
                        uStack_538 = uVar273;
                        uStack_534 = uVar273;
                        uStack_530 = uVar273;
                        uStack_52c = uVar273;
                        uStack_528 = uVar273;
                        uStack_524 = uVar273;
                        local_520 = fVar261;
                        fStack_51c = fVar261;
                        fStack_518 = fVar261;
                        fStack_514 = fVar261;
                        fStack_510 = fVar261;
                        fStack_50c = fVar261;
                        fStack_508 = fVar261;
                        fStack_504 = fVar261;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_600._0_8_;
                        uStack_4d8 = local_600._8_8_;
                        uStack_4d0 = local_600._16_8_;
                        uStack_4c8 = local_600._24_8_;
                        local_4c0 = local_5e0;
                        auVar103 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8e0[1] = auVar103;
                        *local_8e0 = auVar103;
                        local_4a0 = pRVar10->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar10->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar262;
                        local_820 = local_620._0_8_;
                        uStack_818 = local_620._8_8_;
                        uStack_810 = local_620._16_8_;
                        uStack_808 = local_620._24_8_;
                        local_920.valid = (int *)&local_820;
                        local_920.geometryUserPtr = pGVar4->userPtr;
                        local_920.context = context->user;
                        local_920.hit = local_580;
                        local_920.N = 8;
                        local_920.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_920);
                          auVar282 = ZEXT3264(local_8c0);
                        }
                        auVar66._8_8_ = uStack_818;
                        auVar66._0_8_ = local_820;
                        auVar66._16_8_ = uStack_810;
                        auVar66._24_8_ = uStack_808;
                        if (auVar66 != (undefined1  [32])0x0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_920);
                            auVar282 = ZEXT3264(local_8c0);
                          }
                          auVar67._8_8_ = uStack_818;
                          auVar67._0_8_ = local_820;
                          auVar67._16_8_ = uStack_810;
                          auVar67._24_8_ = uStack_808;
                          if (auVar67 != (undefined1  [32])0x0) {
                            uVar84 = vptestmd_avx512vl(auVar67,auVar67);
                            iVar57 = *(int *)(local_920.hit + 4);
                            iVar58 = *(int *)(local_920.hit + 8);
                            iVar59 = *(int *)(local_920.hit + 0xc);
                            iVar60 = *(int *)(local_920.hit + 0x10);
                            iVar61 = *(int *)(local_920.hit + 0x14);
                            iVar62 = *(int *)(local_920.hit + 0x18);
                            iVar63 = *(int *)(local_920.hit + 0x1c);
                            bVar78 = (byte)uVar84;
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x180) =
                                 (uint)(bVar78 & 1) * *(int *)local_920.hit |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_920.ray + 0x180);
                            *(uint *)(local_920.ray + 0x184) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x184);
                            *(uint *)(local_920.ray + 0x188) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x188);
                            *(uint *)(local_920.ray + 0x18c) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x18c);
                            *(uint *)(local_920.ray + 400) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 400);
                            *(uint *)(local_920.ray + 0x194) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x194);
                            *(uint *)(local_920.ray + 0x198) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x198);
                            *(uint *)(local_920.ray + 0x19c) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x19c);
                            iVar57 = *(int *)(local_920.hit + 0x24);
                            iVar58 = *(int *)(local_920.hit + 0x28);
                            iVar59 = *(int *)(local_920.hit + 0x2c);
                            iVar60 = *(int *)(local_920.hit + 0x30);
                            iVar61 = *(int *)(local_920.hit + 0x34);
                            iVar62 = *(int *)(local_920.hit + 0x38);
                            iVar63 = *(int *)(local_920.hit + 0x3c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1a0) =
                                 (uint)(bVar78 & 1) * *(int *)(local_920.hit + 0x20) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_920.ray + 0x1a0);
                            *(uint *)(local_920.ray + 0x1a4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1a4);
                            *(uint *)(local_920.ray + 0x1a8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1a8);
                            *(uint *)(local_920.ray + 0x1ac) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1ac);
                            *(uint *)(local_920.ray + 0x1b0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1b0);
                            *(uint *)(local_920.ray + 0x1b4) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x1b4);
                            *(uint *)(local_920.ray + 0x1b8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1b8);
                            *(uint *)(local_920.ray + 0x1bc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1bc);
                            iVar57 = *(int *)(local_920.hit + 0x44);
                            iVar58 = *(int *)(local_920.hit + 0x48);
                            iVar59 = *(int *)(local_920.hit + 0x4c);
                            iVar60 = *(int *)(local_920.hit + 0x50);
                            iVar61 = *(int *)(local_920.hit + 0x54);
                            iVar62 = *(int *)(local_920.hit + 0x58);
                            iVar63 = *(int *)(local_920.hit + 0x5c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1c0) =
                                 (uint)(bVar78 & 1) * *(int *)(local_920.hit + 0x40) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_920.ray + 0x1c0);
                            *(uint *)(local_920.ray + 0x1c4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1c4);
                            *(uint *)(local_920.ray + 0x1c8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1c8);
                            *(uint *)(local_920.ray + 0x1cc) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1cc);
                            *(uint *)(local_920.ray + 0x1d0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1d0);
                            *(uint *)(local_920.ray + 0x1d4) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x1d4);
                            *(uint *)(local_920.ray + 0x1d8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1d8);
                            *(uint *)(local_920.ray + 0x1dc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1dc);
                            iVar57 = *(int *)(local_920.hit + 100);
                            iVar58 = *(int *)(local_920.hit + 0x68);
                            iVar59 = *(int *)(local_920.hit + 0x6c);
                            iVar60 = *(int *)(local_920.hit + 0x70);
                            iVar61 = *(int *)(local_920.hit + 0x74);
                            iVar62 = *(int *)(local_920.hit + 0x78);
                            iVar63 = *(int *)(local_920.hit + 0x7c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x1e0) =
                                 (uint)(bVar78 & 1) * *(int *)(local_920.hit + 0x60) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_920.ray + 0x1e0);
                            *(uint *)(local_920.ray + 0x1e4) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x1e4);
                            *(uint *)(local_920.ray + 0x1e8) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x1e8);
                            *(uint *)(local_920.ray + 0x1ec) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x1ec);
                            *(uint *)(local_920.ray + 0x1f0) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x1f0);
                            *(uint *)(local_920.ray + 500) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 500);
                            *(uint *)(local_920.ray + 0x1f8) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x1f8);
                            *(uint *)(local_920.ray + 0x1fc) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x1fc);
                            iVar57 = *(int *)(local_920.hit + 0x84);
                            iVar58 = *(int *)(local_920.hit + 0x88);
                            iVar59 = *(int *)(local_920.hit + 0x8c);
                            iVar60 = *(int *)(local_920.hit + 0x90);
                            iVar61 = *(int *)(local_920.hit + 0x94);
                            iVar62 = *(int *)(local_920.hit + 0x98);
                            iVar63 = *(int *)(local_920.hit + 0x9c);
                            bVar82 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar14 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar15 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar17 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_920.ray + 0x200) =
                                 (uint)(bVar78 & 1) * *(int *)(local_920.hit + 0x80) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_920.ray + 0x200);
                            *(uint *)(local_920.ray + 0x204) =
                                 (uint)bVar82 * iVar57 |
                                 (uint)!bVar82 * *(int *)(local_920.ray + 0x204);
                            *(uint *)(local_920.ray + 0x208) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_920.ray + 0x208);
                            *(uint *)(local_920.ray + 0x20c) =
                                 (uint)bVar13 * iVar59 |
                                 (uint)!bVar13 * *(int *)(local_920.ray + 0x20c);
                            *(uint *)(local_920.ray + 0x210) =
                                 (uint)bVar14 * iVar60 |
                                 (uint)!bVar14 * *(int *)(local_920.ray + 0x210);
                            *(uint *)(local_920.ray + 0x214) =
                                 (uint)bVar15 * iVar61 |
                                 (uint)!bVar15 * *(int *)(local_920.ray + 0x214);
                            *(uint *)(local_920.ray + 0x218) =
                                 (uint)bVar16 * iVar62 |
                                 (uint)!bVar16 * *(int *)(local_920.ray + 0x218);
                            *(uint *)(local_920.ray + 0x21c) =
                                 (uint)bVar17 * iVar63 |
                                 (uint)!bVar17 * *(int *)(local_920.ray + 0x21c);
                            auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xa0));
                            *(undefined1 (*) [32])(local_920.ray + 0x220) = auVar103;
                            auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xc0));
                            *(undefined1 (*) [32])(local_920.ray + 0x240) = auVar103;
                            auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0xe0));
                            *(undefined1 (*) [32])(local_920.ray + 0x260) = auVar103;
                            auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_920.hit + 0x100));
                            *(undefined1 (*) [32])(local_920.ray + 0x280) = auVar103;
                            goto LAB_01c747cf;
                          }
                        }
                        auVar244 = ZEXT464((uint)fVar277);
                        *(float *)(ray + k * 4 + 0x100) = fVar277;
                      }
                    }
                  }
                }
              }
              bVar82 = lVar81 != 0;
              lVar81 = lVar81 + -1;
            } while ((!bVar11) && (bVar82));
            auVar69._4_4_ = fStack_69c;
            auVar69._0_4_ = local_6a0;
            auVar69._8_4_ = fStack_698;
            auVar69._12_4_ = fStack_694;
            auVar69._16_4_ = fStack_690;
            auVar69._20_4_ = fStack_68c;
            auVar69._24_4_ = fStack_688;
            auVar69._28_4_ = fStack_684;
            uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar47._4_4_ = uVar273;
            auVar47._0_4_ = uVar273;
            auVar47._8_4_ = uVar273;
            auVar47._12_4_ = uVar273;
            auVar47._16_4_ = uVar273;
            auVar47._20_4_ = uVar273;
            auVar47._24_4_ = uVar273;
            auVar47._28_4_ = uVar273;
            uVar26 = vcmpps_avx512vl(auVar69,auVar47,2);
            bVar79 = ~('\x01' << ((byte)iVar29 & 0x1f)) & bVar79 & (byte)uVar26;
          } while (bVar79 != 0);
        }
        uVar27 = vpcmpd_avx512vl(local_5c0,_local_6c0,1);
        uVar28 = vpcmpd_avx512vl(local_5c0,local_420,1);
        auVar203._0_4_ = (float)local_840._0_4_ + (float)local_1c0._0_4_;
        auVar203._4_4_ = (float)local_840._4_4_ + (float)local_1c0._4_4_;
        auVar203._8_4_ = fStack_838 + fStack_1b8;
        auVar203._12_4_ = fStack_834 + fStack_1b4;
        auVar203._16_4_ = fStack_830 + fStack_1b0;
        auVar203._20_4_ = fStack_82c + fStack_1ac;
        auVar203._24_4_ = fStack_828 + fStack_1a8;
        auVar203._28_4_ = fStack_824 + fStack_1a4;
        uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar224._4_4_ = uVar273;
        auVar224._0_4_ = uVar273;
        auVar224._8_4_ = uVar273;
        auVar224._12_4_ = uVar273;
        auVar224._16_4_ = uVar273;
        auVar224._20_4_ = uVar273;
        auVar224._24_4_ = uVar273;
        auVar224._28_4_ = uVar273;
        uVar26 = vcmpps_avx512vl(auVar203,auVar224,2);
        bVar74 = bVar74 & (byte)uVar28 & (byte)uVar26;
        auVar233._0_4_ = (float)local_840._0_4_ + (float)local_460._0_4_;
        auVar233._4_4_ = (float)local_840._4_4_ + (float)local_460._4_4_;
        auVar233._8_4_ = fStack_838 + fStack_458;
        auVar233._12_4_ = fStack_834 + fStack_454;
        auVar233._16_4_ = fStack_830 + fStack_450;
        auVar233._20_4_ = fStack_82c + fStack_44c;
        auVar233._24_4_ = fStack_828 + fStack_448;
        auVar233._28_4_ = fStack_824 + fStack_444;
        auVar234 = ZEXT3264(auVar233);
        uVar26 = vcmpps_avx512vl(auVar233,auVar224,2);
        bVar76 = bVar76 & (byte)uVar27 & (byte)uVar26 | bVar74;
        prim = local_8d8;
        if (bVar76 == 0) {
          auVar276 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar278 = ZEXT3264(_DAT_02020f20);
        }
        else {
          abStack_180[uVar73 * 0x60] = bVar76;
          bVar11 = (bool)(bVar74 >> 1 & 1);
          bVar82 = (bool)(bVar74 >> 2 & 1);
          bVar12 = (bool)(bVar74 >> 3 & 1);
          bVar13 = (bool)(bVar74 >> 4 & 1);
          bVar14 = (bool)(bVar74 >> 5 & 1);
          auStack_160[uVar73 * 0x18] =
               (uint)(bVar74 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar74 & 1) * local_460._0_4_;
          auStack_160[uVar73 * 0x18 + 1] =
               (uint)bVar11 * local_1c0._4_4_ | (uint)!bVar11 * local_460._4_4_;
          auStack_160[uVar73 * 0x18 + 2] =
               (uint)bVar82 * (int)fStack_1b8 | (uint)!bVar82 * (int)fStack_458;
          auStack_160[uVar73 * 0x18 + 3] =
               (uint)bVar12 * (int)fStack_1b4 | (uint)!bVar12 * (int)fStack_454;
          auStack_160[uVar73 * 0x18 + 4] =
               (uint)bVar13 * (int)fStack_1b0 | (uint)!bVar13 * (int)fStack_450;
          auStack_160[uVar73 * 0x18 + 5] =
               (uint)bVar14 * (int)fStack_1ac | (uint)!bVar14 * (int)fStack_44c;
          auStack_160[uVar73 * 0x18 + 6] =
               (uint)(bVar74 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar74 >> 6) * (int)fStack_448;
          (&fStack_144)[uVar73 * 0x18] = fStack_444;
          uVar26 = vmovlps_avx(local_8f0);
          (&uStack_140)[uVar73 * 0xc] = uVar26;
          afStack_138[uVar73 * 0x18] = (float)((int)local_8d0 + 1);
          uVar73 = (ulong)((int)uVar73 + 1);
          auVar276 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar278 = ZEXT3264(_DAT_02020f20);
        }
      }
    }
    auVar225 = ZEXT1664(local_8f0);
    do {
      if ((int)uVar73 == 0) {
        uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar40._4_4_ = uVar273;
        auVar40._0_4_ = uVar273;
        auVar40._8_4_ = uVar273;
        auVar40._12_4_ = uVar273;
        uVar26 = vcmpps_avx512vl(local_630,auVar40,2);
        uVar75 = (uint)uVar26 & (uint)uVar83 - 1 & (uint)uVar83;
        uVar83 = (ulong)uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_01c72248;
      }
      uVar84 = (ulong)((int)uVar73 - 1);
      auVar103 = *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x18);
      auVar200._0_4_ = (float)local_840._0_4_ + auVar103._0_4_;
      auVar200._4_4_ = (float)local_840._4_4_ + auVar103._4_4_;
      auVar200._8_4_ = fStack_838 + auVar103._8_4_;
      auVar200._12_4_ = fStack_834 + auVar103._12_4_;
      auVar200._16_4_ = fStack_830 + auVar103._16_4_;
      auVar200._20_4_ = fStack_82c + auVar103._20_4_;
      auVar200._24_4_ = fStack_828 + auVar103._24_4_;
      auVar200._28_4_ = fStack_824 + auVar103._28_4_;
      uVar273 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar48._4_4_ = uVar273;
      auVar48._0_4_ = uVar273;
      auVar48._8_4_ = uVar273;
      auVar48._12_4_ = uVar273;
      auVar48._16_4_ = uVar273;
      auVar48._20_4_ = uVar273;
      auVar48._24_4_ = uVar273;
      auVar48._28_4_ = uVar273;
      uVar26 = vcmpps_avx512vl(auVar200,auVar48,2);
      uVar85 = (uint)uVar26 & (uint)abStack_180[uVar84 * 0x60];
      bVar76 = (byte)uVar85;
      if (uVar85 != 0) {
        auVar201._8_4_ = 0x7f800000;
        auVar201._0_8_ = 0x7f8000007f800000;
        auVar201._12_4_ = 0x7f800000;
        auVar201._16_4_ = 0x7f800000;
        auVar201._20_4_ = 0x7f800000;
        auVar201._24_4_ = 0x7f800000;
        auVar201._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar201,auVar103);
        auVar142._0_4_ =
             (uint)(bVar76 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)auVar103._0_4_;
        bVar11 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * (int)auVar103._4_4_;
        bVar11 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * (int)auVar103._8_4_;
        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * (int)auVar103._12_4_;
        bVar11 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar142._16_4_ = (uint)bVar11 * auVar104._16_4_ | (uint)!bVar11 * (int)auVar103._16_4_;
        bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar142._20_4_ = (uint)bVar11 * auVar104._20_4_ | (uint)!bVar11 * (int)auVar103._20_4_;
        bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar142._24_4_ = (uint)bVar11 * auVar104._24_4_ | (uint)!bVar11 * (int)auVar103._24_4_;
        auVar142._28_4_ =
             (uVar85 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar85 >> 7,0) * (int)auVar103._28_4_;
        auVar103 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar103 = vminps_avx(auVar142,auVar103);
        auVar104 = vshufpd_avx(auVar103,auVar103,5);
        auVar103 = vminps_avx(auVar103,auVar104);
        auVar104 = vpermpd_avx2(auVar103,0x4e);
        auVar103 = vminps_avx(auVar103,auVar104);
        uVar26 = vcmpps_avx512vl(auVar142,auVar103,0);
        bVar79 = (byte)uVar26 & bVar76;
        if (bVar79 != 0) {
          uVar85 = (uint)bVar79;
        }
        fVar253 = afStack_138[uVar84 * 0x18 + -1];
        uVar149 = 0;
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
          uVar149 = uVar149 + 1;
        }
        local_8d0 = (ulong)(uint)afStack_138[uVar84 * 0x18];
        bVar79 = ~('\x01' << ((byte)uVar149 & 0x1f)) & bVar76;
        abStack_180[uVar84 * 0x60] = bVar79;
        uVar80 = uVar84;
        if (bVar79 != 0) {
          uVar80 = uVar73;
        }
        fVar261 = *(float *)(&uStack_140 + uVar84 * 0xc);
        auVar202._4_4_ = fVar261;
        auVar202._0_4_ = fVar261;
        auVar202._8_4_ = fVar261;
        auVar202._12_4_ = fVar261;
        auVar202._16_4_ = fVar261;
        auVar202._20_4_ = fVar261;
        auVar202._24_4_ = fVar261;
        auVar202._28_4_ = fVar261;
        fVar253 = fVar253 - fVar261;
        auVar174._4_4_ = fVar253;
        auVar174._0_4_ = fVar253;
        auVar174._8_4_ = fVar253;
        auVar174._12_4_ = fVar253;
        auVar174._16_4_ = fVar253;
        auVar174._20_4_ = fVar253;
        auVar174._24_4_ = fVar253;
        auVar174._28_4_ = fVar253;
        auVar92 = vfmadd132ps_fma(auVar174,auVar202,auVar278._0_32_);
        auVar103 = ZEXT1632(auVar92);
        local_580[0] = (RTCHitN)auVar103[0];
        local_580[1] = (RTCHitN)auVar103[1];
        local_580[2] = (RTCHitN)auVar103[2];
        local_580[3] = (RTCHitN)auVar103[3];
        local_580[4] = (RTCHitN)auVar103[4];
        local_580[5] = (RTCHitN)auVar103[5];
        local_580[6] = (RTCHitN)auVar103[6];
        local_580[7] = (RTCHitN)auVar103[7];
        local_580[8] = (RTCHitN)auVar103[8];
        local_580[9] = (RTCHitN)auVar103[9];
        local_580[10] = (RTCHitN)auVar103[10];
        local_580[0xb] = (RTCHitN)auVar103[0xb];
        local_580[0xc] = (RTCHitN)auVar103[0xc];
        local_580[0xd] = (RTCHitN)auVar103[0xd];
        local_580[0xe] = (RTCHitN)auVar103[0xe];
        local_580[0xf] = (RTCHitN)auVar103[0xf];
        local_580[0x10] = (RTCHitN)auVar103[0x10];
        local_580[0x11] = (RTCHitN)auVar103[0x11];
        local_580[0x12] = (RTCHitN)auVar103[0x12];
        local_580[0x13] = (RTCHitN)auVar103[0x13];
        local_580[0x14] = (RTCHitN)auVar103[0x14];
        local_580[0x15] = (RTCHitN)auVar103[0x15];
        local_580[0x16] = (RTCHitN)auVar103[0x16];
        local_580[0x17] = (RTCHitN)auVar103[0x17];
        local_580[0x18] = (RTCHitN)auVar103[0x18];
        local_580[0x19] = (RTCHitN)auVar103[0x19];
        local_580[0x1a] = (RTCHitN)auVar103[0x1a];
        local_580[0x1b] = (RTCHitN)auVar103[0x1b];
        local_580[0x1c] = (RTCHitN)auVar103[0x1c];
        local_580[0x1d] = (RTCHitN)auVar103[0x1d];
        local_580[0x1e] = (RTCHitN)auVar103[0x1e];
        local_580[0x1f] = (RTCHitN)auVar103[0x1f];
        auVar225 = ZEXT864(*(ulong *)(local_580 + (ulong)uVar149 * 4));
        uVar84 = uVar80;
      }
      uVar73 = uVar84;
    } while (bVar76 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }